

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  float fVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [60];
  undefined1 auVar63 [60];
  undefined1 auVar64 [12];
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  byte bVar86;
  byte bVar87;
  byte bVar88;
  ulong uVar89;
  byte bVar90;
  ulong uVar91;
  byte bVar92;
  byte bVar93;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  uint uVar94;
  long lVar95;
  bool bVar96;
  ulong uVar97;
  uint uVar98;
  uint uVar163;
  uint uVar164;
  uint uVar166;
  uint uVar167;
  uint uVar168;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar102 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar109 [16];
  undefined1 auVar154 [64];
  uint uVar165;
  uint uVar169;
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  float pp;
  float fVar170;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar192;
  undefined1 auVar191 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar193;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  float fVar232;
  float fVar233;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [64];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar248 [16];
  undefined1 auVar251 [32];
  float fVar256;
  float fVar258;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar257;
  float fVar259;
  float fVar261;
  undefined1 auVar254 [16];
  float fVar260;
  float fVar262;
  float fVar263;
  undefined1 auVar255 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined4 uVar266;
  float fVar267;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  undefined1 local_bc0 [16];
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [16];
  undefined1 (*local_ac8) [32];
  Primitive *local_ac0;
  ulong local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  ulong local_9a8;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [64];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  float afStack_160 [2];
  uint auStack_158 [74];
  undefined1 auVar158 [64];
  undefined1 auVar162 [64];
  
  PVar1 = prim[1];
  uVar91 = (ulong)(byte)PVar1;
  fVar233 = *(float *)(prim + uVar91 * 0x19 + 0x12);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar108 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar248 = vsubps_avx(auVar101,*(undefined1 (*) [16])(prim + uVar91 * 0x19 + 6));
  fVar232 = fVar233 * auVar248._0_4_;
  fVar170 = fVar233 * auVar108._0_4_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar91 * 4 + 6);
  auVar115 = vpmovsxbd_avx2(auVar101);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar91 * 5 + 6);
  auVar113 = vpmovsxbd_avx2(auVar19);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar91 * 6 + 6);
  auVar116 = vpmovsxbd_avx2(auVar99);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 6);
  auVar117 = vpmovsxbd_avx2(auVar103);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar122 = vpmovsxbd_avx2(auVar104);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar118 = vcvtdq2ps_avx(auVar122);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar91 + 6);
  auVar114 = vpmovsxbd_avx2(auVar105);
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar97 = (ulong)(uint)((int)(uVar91 * 9) * 2);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar97 + 6);
  auVar119 = vpmovsxbd_avx2(auVar106);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar97 + uVar91 + 6);
  auVar120 = vpmovsxbd_avx2(auVar100);
  auVar120 = vcvtdq2ps_avx(auVar120);
  uVar89 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar112 = vpmovsxbd_avx2(auVar107);
  auVar121 = vcvtdq2ps_avx(auVar112);
  auVar132._4_4_ = fVar170;
  auVar132._0_4_ = fVar170;
  auVar132._8_4_ = fVar170;
  auVar132._12_4_ = fVar170;
  auVar132._16_4_ = fVar170;
  auVar132._20_4_ = fVar170;
  auVar132._24_4_ = fVar170;
  auVar132._28_4_ = fVar170;
  auVar134._8_4_ = 1;
  auVar134._0_8_ = 0x100000001;
  auVar134._12_4_ = 1;
  auVar134._16_4_ = 1;
  auVar134._20_4_ = 1;
  auVar134._24_4_ = 1;
  auVar134._28_4_ = 1;
  auVar110 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar124 = ZEXT1632(CONCAT412(fVar233 * auVar108._12_4_,
                                CONCAT48(fVar233 * auVar108._8_4_,
                                         CONCAT44(fVar233 * auVar108._4_4_,fVar170))));
  auVar123 = vpermps_avx2(auVar134,auVar124);
  auVar111 = vpermps_avx512vl(auVar110,auVar124);
  fVar170 = auVar111._0_4_;
  fVar256 = auVar111._4_4_;
  auVar124._4_4_ = fVar256 * auVar116._4_4_;
  auVar124._0_4_ = fVar170 * auVar116._0_4_;
  fVar258 = auVar111._8_4_;
  auVar124._8_4_ = fVar258 * auVar116._8_4_;
  fVar260 = auVar111._12_4_;
  auVar124._12_4_ = fVar260 * auVar116._12_4_;
  fVar267 = auVar111._16_4_;
  auVar124._16_4_ = fVar267 * auVar116._16_4_;
  fVar192 = auVar111._20_4_;
  auVar124._20_4_ = fVar192 * auVar116._20_4_;
  fVar262 = auVar111._24_4_;
  auVar124._24_4_ = fVar262 * auVar116._24_4_;
  auVar124._28_4_ = auVar122._28_4_;
  auVar122._4_4_ = auVar114._4_4_ * fVar256;
  auVar122._0_4_ = auVar114._0_4_ * fVar170;
  auVar122._8_4_ = auVar114._8_4_ * fVar258;
  auVar122._12_4_ = auVar114._12_4_ * fVar260;
  auVar122._16_4_ = auVar114._16_4_ * fVar267;
  auVar122._20_4_ = auVar114._20_4_ * fVar192;
  auVar122._24_4_ = auVar114._24_4_ * fVar262;
  auVar122._28_4_ = auVar112._28_4_;
  auVar112._4_4_ = auVar121._4_4_ * fVar256;
  auVar112._0_4_ = auVar121._0_4_ * fVar170;
  auVar112._8_4_ = auVar121._8_4_ * fVar258;
  auVar112._12_4_ = auVar121._12_4_ * fVar260;
  auVar112._16_4_ = auVar121._16_4_ * fVar267;
  auVar112._20_4_ = auVar121._20_4_ * fVar192;
  auVar112._24_4_ = auVar121._24_4_ * fVar262;
  auVar112._28_4_ = auVar111._28_4_;
  auVar101 = vfmadd231ps_fma(auVar124,auVar123,auVar113);
  auVar19 = vfmadd231ps_fma(auVar122,auVar123,auVar118);
  auVar99 = vfmadd231ps_fma(auVar112,auVar120,auVar123);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar132,auVar115);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar132,auVar117);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar119,auVar132);
  auVar133._4_4_ = fVar232;
  auVar133._0_4_ = fVar232;
  auVar133._8_4_ = fVar232;
  auVar133._12_4_ = fVar232;
  auVar133._16_4_ = fVar232;
  auVar133._20_4_ = fVar232;
  auVar133._24_4_ = fVar232;
  auVar133._28_4_ = fVar232;
  auVar112 = ZEXT1632(CONCAT412(fVar233 * auVar248._12_4_,
                                CONCAT48(fVar233 * auVar248._8_4_,
                                         CONCAT44(fVar233 * auVar248._4_4_,fVar232))));
  auVar122 = vpermps_avx2(auVar134,auVar112);
  auVar112 = vpermps_avx512vl(auVar110,auVar112);
  fVar233 = auVar112._0_4_;
  fVar170 = auVar112._4_4_;
  auVar123._4_4_ = fVar170 * auVar116._4_4_;
  auVar123._0_4_ = fVar233 * auVar116._0_4_;
  fVar256 = auVar112._8_4_;
  auVar123._8_4_ = fVar256 * auVar116._8_4_;
  fVar258 = auVar112._12_4_;
  auVar123._12_4_ = fVar258 * auVar116._12_4_;
  fVar260 = auVar112._16_4_;
  auVar123._16_4_ = fVar260 * auVar116._16_4_;
  fVar267 = auVar112._20_4_;
  auVar123._20_4_ = fVar267 * auVar116._20_4_;
  fVar192 = auVar112._24_4_;
  auVar123._24_4_ = fVar192 * auVar116._24_4_;
  auVar123._28_4_ = 1;
  auVar110._4_4_ = auVar114._4_4_ * fVar170;
  auVar110._0_4_ = auVar114._0_4_ * fVar233;
  auVar110._8_4_ = auVar114._8_4_ * fVar256;
  auVar110._12_4_ = auVar114._12_4_ * fVar258;
  auVar110._16_4_ = auVar114._16_4_ * fVar260;
  auVar110._20_4_ = auVar114._20_4_ * fVar267;
  auVar110._24_4_ = auVar114._24_4_ * fVar192;
  auVar110._28_4_ = auVar116._28_4_;
  auVar114._4_4_ = auVar121._4_4_ * fVar170;
  auVar114._0_4_ = auVar121._0_4_ * fVar233;
  auVar114._8_4_ = auVar121._8_4_ * fVar256;
  auVar114._12_4_ = auVar121._12_4_ * fVar258;
  auVar114._16_4_ = auVar121._16_4_ * fVar260;
  auVar114._20_4_ = auVar121._20_4_ * fVar267;
  auVar114._24_4_ = auVar121._24_4_ * fVar192;
  auVar114._28_4_ = auVar112._28_4_;
  auVar103 = vfmadd231ps_fma(auVar123,auVar122,auVar113);
  auVar104 = vfmadd231ps_fma(auVar110,auVar122,auVar118);
  auVar105 = vfmadd231ps_fma(auVar114,auVar122,auVar120);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar133,auVar115);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar133,auVar117);
  auVar129._8_4_ = 0x7fffffff;
  auVar129._0_8_ = 0x7fffffff7fffffff;
  auVar129._12_4_ = 0x7fffffff;
  auVar129._16_4_ = 0x7fffffff;
  auVar129._20_4_ = 0x7fffffff;
  auVar129._24_4_ = 0x7fffffff;
  auVar129._28_4_ = 0x7fffffff;
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar133,auVar119);
  auVar115 = vandps_avx(ZEXT1632(auVar101),auVar129);
  auVar131._8_4_ = 0x219392ef;
  auVar131._0_8_ = 0x219392ef219392ef;
  auVar131._12_4_ = 0x219392ef;
  auVar131._16_4_ = 0x219392ef;
  auVar131._20_4_ = 0x219392ef;
  auVar131._24_4_ = 0x219392ef;
  auVar131._28_4_ = 0x219392ef;
  uVar97 = vcmpps_avx512vl(auVar115,auVar131,1);
  bVar5 = (bool)((byte)uVar97 & 1);
  auVar111._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar101._0_4_;
  bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar101._4_4_;
  bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar101._8_4_;
  bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar101._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar97 >> 7) * 0x219392ef;
  auVar115 = vandps_avx(ZEXT1632(auVar19),auVar129);
  uVar97 = vcmpps_avx512vl(auVar115,auVar131,1);
  bVar5 = (bool)((byte)uVar97 & 1);
  auVar125._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar19._0_4_;
  bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
  auVar125._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar19._4_4_;
  bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
  auVar125._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar19._8_4_;
  bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
  auVar125._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar19._12_4_;
  auVar125._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * 0x219392ef;
  auVar125._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * 0x219392ef;
  auVar125._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * 0x219392ef;
  auVar125._28_4_ = (uint)(byte)(uVar97 >> 7) * 0x219392ef;
  auVar115 = vandps_avx(ZEXT1632(auVar99),auVar129);
  uVar97 = vcmpps_avx512vl(auVar115,auVar131,1);
  bVar5 = (bool)((byte)uVar97 & 1);
  auVar115._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar99._0_4_;
  bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar99._4_4_;
  bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar99._8_4_;
  bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar99._12_4_;
  auVar115._16_4_ = (uint)((byte)(uVar97 >> 4) & 1) * 0x219392ef;
  auVar115._20_4_ = (uint)((byte)(uVar97 >> 5) & 1) * 0x219392ef;
  auVar115._24_4_ = (uint)((byte)(uVar97 >> 6) & 1) * 0x219392ef;
  auVar115._28_4_ = (uint)(byte)(uVar97 >> 7) * 0x219392ef;
  auVar113 = vrcp14ps_avx512vl(auVar111);
  auVar130._8_4_ = 0x3f800000;
  auVar130._0_8_ = &DAT_3f8000003f800000;
  auVar130._12_4_ = 0x3f800000;
  auVar130._16_4_ = 0x3f800000;
  auVar130._20_4_ = 0x3f800000;
  auVar130._24_4_ = 0x3f800000;
  auVar130._28_4_ = 0x3f800000;
  auVar101 = vfnmadd213ps_fma(auVar111,auVar113,auVar130);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar125);
  auVar19 = vfnmadd213ps_fma(auVar125,auVar113,auVar130);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar115);
  auVar99 = vfnmadd213ps_fma(auVar115,auVar113,auVar130);
  auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar113,auVar113);
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 7 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar103));
  auVar119._4_4_ = auVar101._4_4_ * auVar115._4_4_;
  auVar119._0_4_ = auVar101._0_4_ * auVar115._0_4_;
  auVar119._8_4_ = auVar101._8_4_ * auVar115._8_4_;
  auVar119._12_4_ = auVar101._12_4_ * auVar115._12_4_;
  auVar119._16_4_ = auVar115._16_4_ * 0.0;
  auVar119._20_4_ = auVar115._20_4_ * 0.0;
  auVar119._24_4_ = auVar115._24_4_ * 0.0;
  auVar119._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 9 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar103));
  auVar114 = vpbroadcastd_avx512vl();
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar128._0_4_ = auVar101._0_4_ * auVar115._0_4_;
  auVar128._4_4_ = auVar101._4_4_ * auVar115._4_4_;
  auVar128._8_4_ = auVar101._8_4_ * auVar115._8_4_;
  auVar128._12_4_ = auVar101._12_4_ * auVar115._12_4_;
  auVar128._16_4_ = auVar115._16_4_ * 0.0;
  auVar128._20_4_ = auVar115._20_4_ * 0.0;
  auVar128._24_4_ = auVar115._24_4_ * 0.0;
  auVar128._28_4_ = 0;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar1 * 0x10 + uVar91 * -2 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar104));
  auVar120._4_4_ = auVar19._4_4_ * auVar115._4_4_;
  auVar120._0_4_ = auVar19._0_4_ * auVar115._0_4_;
  auVar120._8_4_ = auVar19._8_4_ * auVar115._8_4_;
  auVar120._12_4_ = auVar19._12_4_ * auVar115._12_4_;
  auVar120._16_4_ = auVar115._16_4_ * 0.0;
  auVar120._20_4_ = auVar115._20_4_ * 0.0;
  auVar120._24_4_ = auVar115._24_4_ * 0.0;
  auVar120._28_4_ = auVar115._28_4_;
  auVar115 = vcvtdq2ps_avx(auVar113);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar104));
  auVar127._0_4_ = auVar19._0_4_ * auVar115._0_4_;
  auVar127._4_4_ = auVar19._4_4_ * auVar115._4_4_;
  auVar127._8_4_ = auVar19._8_4_ * auVar115._8_4_;
  auVar127._12_4_ = auVar19._12_4_ * auVar115._12_4_;
  auVar127._16_4_ = auVar115._16_4_ * 0.0;
  auVar127._20_4_ = auVar115._20_4_ * 0.0;
  auVar127._24_4_ = auVar115._24_4_ * 0.0;
  auVar127._28_4_ = 0;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 + uVar91 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar105));
  auVar121._4_4_ = auVar115._4_4_ * auVar99._4_4_;
  auVar121._0_4_ = auVar115._0_4_ * auVar99._0_4_;
  auVar121._8_4_ = auVar115._8_4_ * auVar99._8_4_;
  auVar121._12_4_ = auVar115._12_4_ * auVar99._12_4_;
  auVar121._16_4_ = auVar115._16_4_ * 0.0;
  auVar121._20_4_ = auVar115._20_4_ * 0.0;
  auVar121._24_4_ = auVar115._24_4_ * 0.0;
  auVar121._28_4_ = auVar115._28_4_;
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x17 + 6));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,ZEXT1632(auVar105));
  auVar126._0_4_ = auVar99._0_4_ * auVar115._0_4_;
  auVar126._4_4_ = auVar99._4_4_ * auVar115._4_4_;
  auVar126._8_4_ = auVar99._8_4_ * auVar115._8_4_;
  auVar126._12_4_ = auVar99._12_4_ * auVar115._12_4_;
  auVar126._16_4_ = auVar115._16_4_ * 0.0;
  auVar126._20_4_ = auVar115._20_4_ * 0.0;
  auVar126._24_4_ = auVar115._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar115 = vpminsd_avx2(auVar119,auVar128);
  auVar113 = vpminsd_avx2(auVar120,auVar127);
  auVar115 = vmaxps_avx(auVar115,auVar113);
  auVar113 = vpminsd_avx2(auVar121,auVar126);
  uVar266 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar116._4_4_ = uVar266;
  auVar116._0_4_ = uVar266;
  auVar116._8_4_ = uVar266;
  auVar116._12_4_ = uVar266;
  auVar116._16_4_ = uVar266;
  auVar116._20_4_ = uVar266;
  auVar116._24_4_ = uVar266;
  auVar116._28_4_ = uVar266;
  auVar113 = vmaxps_avx512vl(auVar113,auVar116);
  auVar115 = vmaxps_avx(auVar115,auVar113);
  auVar113._8_4_ = 0x3f7ffffa;
  auVar113._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar113._12_4_ = 0x3f7ffffa;
  auVar113._16_4_ = 0x3f7ffffa;
  auVar113._20_4_ = 0x3f7ffffa;
  auVar113._24_4_ = 0x3f7ffffa;
  auVar113._28_4_ = 0x3f7ffffa;
  local_760 = vmulps_avx512vl(auVar115,auVar113);
  auVar115 = vpmaxsd_avx2(auVar119,auVar128);
  auVar113 = vpmaxsd_avx2(auVar120,auVar127);
  auVar115 = vminps_avx(auVar115,auVar113);
  auVar113 = vpmaxsd_avx2(auVar121,auVar126);
  uVar266 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar117._4_4_ = uVar266;
  auVar117._0_4_ = uVar266;
  auVar117._8_4_ = uVar266;
  auVar117._12_4_ = uVar266;
  auVar117._16_4_ = uVar266;
  auVar117._20_4_ = uVar266;
  auVar117._24_4_ = uVar266;
  auVar117._28_4_ = uVar266;
  auVar113 = vminps_avx512vl(auVar113,auVar117);
  auVar115 = vminps_avx(auVar115,auVar113);
  auVar118._8_4_ = 0x3f800003;
  auVar118._0_8_ = 0x3f8000033f800003;
  auVar118._12_4_ = 0x3f800003;
  auVar118._16_4_ = 0x3f800003;
  auVar118._20_4_ = 0x3f800003;
  auVar118._24_4_ = 0x3f800003;
  auVar118._28_4_ = 0x3f800003;
  auVar115 = vmulps_avx512vl(auVar115,auVar118);
  uVar23 = vpcmpgtd_avx512vl(auVar114,_DAT_0205a920);
  uVar21 = vcmpps_avx512vl(local_760,auVar115,2);
  if ((byte)((byte)uVar21 & (byte)uVar23) == 0) {
    return;
  }
  local_ab0 = (ulong)(byte)((byte)uVar21 & (byte)uVar23);
  local_ac8 = (undefined1 (*) [32])local_240;
  auVar191 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar191);
  local_ac0 = prim;
LAB_01d7e770:
  lVar95 = 0;
  for (uVar97 = local_ab0; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
    lVar95 = lVar95 + 1;
  }
  uVar94 = *(uint *)(prim + 2);
  local_aa8 = (ulong)*(uint *)(prim + lVar95 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar94].ptr;
  lVar95 = *(long *)&pGVar2[1].time_range.upper;
  uVar97 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           local_aa8 *
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar101 = *(undefined1 (*) [16])(lVar95 + (long)pGVar2[1].intersectionFilterN * uVar97);
  auVar19 = *(undefined1 (*) [16])(lVar95 + (long)pGVar2[1].intersectionFilterN * (uVar97 + 1));
  auVar99 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar103 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar115 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar155._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar99 = vunpcklps_avx512vl(auVar115._0_16_,auVar155._0_16_);
  auVar191._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar272 = ZEXT3264(auVar191._0_32_);
  auVar107 = auVar191._0_16_;
  local_a30 = vinsertps_avx512f(auVar99,auVar107,0x28);
  auVar248._8_4_ = 0xbeaaaaab;
  auVar248._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar248._12_4_ = 0xbeaaaaab;
  auVar105 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               (pGVar2[2].intersectionFilterN +
                               uVar97 * (long)pGVar2[2].pointQueryFunc),auVar101,auVar248);
  auVar104 = vfmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar2[2].intersectionFilterN +
                              (long)pGVar2[2].pointQueryFunc * (uVar97 + 1)),auVar19,auVar248);
  auVar102._0_4_ = auVar19._0_4_ + auVar101._0_4_ + auVar105._0_4_ + auVar104._0_4_;
  auVar102._4_4_ = auVar19._4_4_ + auVar101._4_4_ + auVar105._4_4_ + auVar104._4_4_;
  auVar102._8_4_ = auVar19._8_4_ + auVar101._8_4_ + auVar105._8_4_ + auVar104._8_4_;
  auVar102._12_4_ = auVar19._12_4_ + auVar101._12_4_ + auVar105._12_4_ + auVar104._12_4_;
  auVar108._8_4_ = 0x3e800000;
  auVar108._0_8_ = 0x3e8000003e800000;
  auVar108._12_4_ = 0x3e800000;
  auVar99 = vmulps_avx512vl(auVar102,auVar108);
  auVar99 = vsubps_avx(auVar99,auVar103);
  auVar99 = vdpps_avx(auVar99,local_a30,0x7f);
  fVar233 = *(float *)(ray + k * 4 + 0xc0);
  local_a40 = vdpps_avx(local_a30,local_a30,0x7f);
  auVar109._4_12_ = ZEXT812(0) << 0x20;
  auVar109._0_4_ = local_a40._0_4_;
  auVar100 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar109);
  auVar106 = vfnmadd213ss_fma(auVar100,local_a40,ZEXT416(0x40000000));
  local_740 = auVar99._0_4_ * auVar100._0_4_ * auVar106._0_4_;
  auVar252._4_4_ = local_740;
  auVar252._0_4_ = local_740;
  auVar252._8_4_ = local_740;
  auVar252._12_4_ = local_740;
  fStack_8f0 = local_740;
  _local_900 = auVar252;
  fStack_8ec = local_740;
  fStack_8e8 = local_740;
  fStack_8e4 = local_740;
  auVar99 = vfmadd231ps_fma(auVar103,local_a30,auVar252);
  auVar99 = vblendps_avx(auVar99,ZEXT816(0) << 0x40,8);
  auVar101 = vsubps_avx(auVar101,auVar99);
  auVar103 = vsubps_avx(auVar104,auVar99);
  auVar104 = vsubps_avx(auVar105,auVar99);
  auVar237 = ZEXT3264(_DAT_02020f20);
  auVar19 = vsubps_avx(auVar19,auVar99);
  local_520 = auVar101._0_4_;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  auVar136._8_4_ = 1;
  auVar136._0_8_ = 0x100000001;
  auVar136._12_4_ = 1;
  auVar136._16_4_ = 1;
  auVar136._20_4_ = 1;
  auVar136._24_4_ = 1;
  auVar136._28_4_ = 1;
  local_940 = ZEXT1632(auVar101);
  local_540 = vpermps_avx2(auVar136,local_940);
  auVar137._8_4_ = 2;
  auVar137._0_8_ = 0x200000002;
  auVar137._12_4_ = 2;
  auVar137._16_4_ = 2;
  auVar137._20_4_ = 2;
  auVar137._24_4_ = 2;
  auVar137._28_4_ = 2;
  local_560 = vpermps_avx2(auVar137,local_940);
  auVar140._8_4_ = 3;
  auVar140._0_8_ = 0x300000003;
  auVar140._12_4_ = 3;
  auVar140._16_4_ = 3;
  auVar140._20_4_ = 3;
  auVar140._24_4_ = 3;
  auVar140._28_4_ = 3;
  local_580 = vpermps_avx2(auVar140,local_940);
  local_5a0 = auVar104._0_4_;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  local_980 = ZEXT1632(auVar104);
  local_5c0 = vpermps_avx2(auVar136,local_980);
  local_5e0 = vpermps_avx2(auVar137,local_980);
  local_600 = vpermps_avx2(auVar140,local_980);
  local_620 = auVar103._0_4_;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  local_960 = ZEXT1632(auVar103);
  local_640 = vpermps_avx2(auVar136,local_960);
  local_660 = vpermps_avx2(auVar137,local_960);
  local_680 = vpermps_avx2(auVar140,local_960);
  uVar266 = auVar19._0_4_;
  local_6a0._4_4_ = uVar266;
  local_6a0._0_4_ = uVar266;
  fStack_698 = (float)uVar266;
  fStack_694 = (float)uVar266;
  fStack_690 = (float)uVar266;
  fStack_68c = (float)uVar266;
  fStack_688 = (float)uVar266;
  register0x0000131c = uVar266;
  auVar247 = ZEXT3264(_local_6a0);
  _local_9a0 = ZEXT1632(auVar19);
  _local_6c0 = vpermps_avx2(auVar136,_local_9a0);
  _local_6e0 = vpermps_avx2(auVar137,_local_9a0);
  _local_700 = vpermps_avx2(auVar140,_local_9a0);
  auVar101 = vmulss_avx512f(auVar107,auVar107);
  auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),auVar155._0_32_,auVar155._0_32_);
  local_7e0 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar115);
  local_720._0_4_ = local_7e0._0_4_;
  local_720._4_4_ = local_720._0_4_;
  local_720._8_4_ = local_720._0_4_;
  local_720._12_4_ = local_720._0_4_;
  local_720._16_4_ = local_720._0_4_;
  local_720._20_4_ = local_720._0_4_;
  local_720._24_4_ = local_720._0_4_;
  local_720._28_4_ = local_720._0_4_;
  auVar135._8_4_ = 0x7fffffff;
  auVar135._0_8_ = 0x7fffffff7fffffff;
  auVar135._12_4_ = 0x7fffffff;
  auVar135._16_4_ = 0x7fffffff;
  auVar135._20_4_ = 0x7fffffff;
  auVar135._24_4_ = 0x7fffffff;
  auVar135._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_720,auVar135);
  local_a10 = ZEXT416((uint)local_740);
  local_740 = fVar233 - local_740;
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  auVar154 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar154);
  local_ab8 = 0;
  local_9a8 = 1;
  auVar154 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar154);
  auVar101 = vsqrtss_avx(local_a40,local_a40);
  auVar19 = vsqrtss_avx(local_a40,local_a40);
  auVar231 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar191._32_32_ = auVar154._32_32_;
  local_aa0 = auVar191._0_32_;
  do {
    local_ae0 = auVar231._0_16_;
    auVar99 = vmovshdup_avx(local_ae0);
    auVar102 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    fVar170 = auVar231._0_4_;
    fVar192 = auVar99._0_4_ - fVar170;
    fVar267 = fVar192 * 0.04761905;
    auVar251._4_4_ = fVar170;
    auVar251._0_4_ = fVar170;
    auVar251._8_4_ = fVar170;
    auVar251._12_4_ = fVar170;
    auVar251._16_4_ = fVar170;
    auVar251._20_4_ = fVar170;
    auVar251._24_4_ = fVar170;
    auVar251._28_4_ = fVar170;
    local_a60._4_4_ = fVar192;
    local_a60._0_4_ = fVar192;
    local_a60._8_4_ = fVar192;
    local_a60._12_4_ = fVar192;
    local_a60._16_4_ = fVar192;
    local_a60._20_4_ = fVar192;
    local_a60._24_4_ = fVar192;
    local_a60._28_4_ = fVar192;
    auVar99 = vfmadd231ps_fma(auVar251,local_a60,auVar237._0_32_);
    auVar179._8_4_ = 0x3f800000;
    auVar179._0_8_ = &DAT_3f8000003f800000;
    auVar179._12_4_ = 0x3f800000;
    auVar179._16_4_ = 0x3f800000;
    auVar179._20_4_ = 0x3f800000;
    auVar179._24_4_ = 0x3f800000;
    auVar179._28_4_ = 0x3f800000;
    auVar113 = vsubps_avx(auVar179,ZEXT1632(auVar99));
    auVar84._4_4_ = fStack_59c;
    auVar84._0_4_ = local_5a0;
    auVar84._8_4_ = fStack_598;
    auVar84._12_4_ = fStack_594;
    auVar84._16_4_ = fStack_590;
    auVar84._20_4_ = fStack_58c;
    auVar84._24_4_ = fStack_588;
    auVar84._28_4_ = fStack_584;
    fVar170 = auVar99._0_4_;
    auVar206._0_4_ = local_5a0 * fVar170;
    fVar256 = auVar99._4_4_;
    auVar206._4_4_ = fStack_59c * fVar256;
    fVar258 = auVar99._8_4_;
    auVar206._8_4_ = fStack_598 * fVar258;
    fVar260 = auVar99._12_4_;
    auVar206._12_4_ = fStack_594 * fVar260;
    auVar206._16_4_ = fStack_590 * 0.0;
    auVar206._20_4_ = fStack_58c * 0.0;
    auVar206._24_4_ = fStack_588 * 0.0;
    auVar206._28_4_ = 0;
    auVar154._0_4_ = local_5c0._0_4_ * fVar170;
    auVar154._4_4_ = local_5c0._4_4_ * fVar256;
    auVar154._8_4_ = local_5c0._8_4_ * fVar258;
    auVar154._12_4_ = local_5c0._12_4_ * fVar260;
    auVar154._16_4_ = local_5c0._16_4_ * 0.0;
    auVar154._20_4_ = local_5c0._20_4_ * 0.0;
    auVar154._28_36_ = auVar231._28_36_;
    auVar154._24_4_ = local_5c0._24_4_ * 0.0;
    auVar231._0_4_ = local_5e0._0_4_ * fVar170;
    auVar231._4_4_ = local_5e0._4_4_ * fVar256;
    auVar231._8_4_ = local_5e0._8_4_ * fVar258;
    auVar231._12_4_ = local_5e0._12_4_ * fVar260;
    auVar231._16_4_ = local_5e0._16_4_ * 0.0;
    auVar231._20_4_ = local_5e0._20_4_ * 0.0;
    auVar231._28_36_ = auVar237._28_36_;
    auVar231._24_4_ = local_5e0._24_4_ * 0.0;
    auVar237._0_4_ = local_600._0_4_ * fVar170;
    auVar237._4_4_ = local_600._4_4_ * fVar256;
    auVar237._8_4_ = local_600._8_4_ * fVar258;
    auVar237._12_4_ = local_600._12_4_ * fVar260;
    auVar237._16_4_ = local_600._16_4_ * 0.0;
    auVar237._20_4_ = local_600._20_4_ * 0.0;
    auVar237._28_36_ = auVar247._28_36_;
    auVar237._24_4_ = local_600._24_4_ * 0.0;
    auVar85._4_4_ = uStack_51c;
    auVar85._0_4_ = local_520;
    auVar85._8_4_ = uStack_518;
    auVar85._12_4_ = uStack_514;
    auVar85._16_4_ = uStack_510;
    auVar85._20_4_ = uStack_50c;
    auVar85._24_4_ = uStack_508;
    auVar85._28_4_ = uStack_504;
    auVar103 = vfmadd231ps_fma(auVar206,auVar113,auVar85);
    auVar104 = vfmadd231ps_fma(auVar154._0_32_,auVar113,local_540);
    auVar105 = vfmadd231ps_fma(auVar231._0_32_,auVar113,local_560);
    auVar106 = vfmadd231ps_fma(auVar237._0_32_,auVar113,local_580);
    auVar83._4_4_ = uStack_61c;
    auVar83._0_4_ = local_620;
    auVar83._8_4_ = uStack_618;
    auVar83._12_4_ = uStack_614;
    auVar83._16_4_ = uStack_610;
    auVar83._20_4_ = uStack_60c;
    auVar83._24_4_ = uStack_608;
    auVar83._28_4_ = uStack_604;
    auVar116 = vmulps_avx512vl(auVar83,ZEXT1632(auVar99));
    auVar122 = ZEXT1632(auVar99);
    auVar117 = vmulps_avx512vl(local_640,auVar122);
    auVar118 = vmulps_avx512vl(local_660,auVar122);
    auVar114 = vmulps_avx512vl(local_680,auVar122);
    auVar100 = vfmadd231ps_fma(auVar116,auVar113,auVar84);
    auVar107 = vfmadd231ps_fma(auVar117,auVar113,local_5c0);
    auVar108 = vfmadd231ps_fma(auVar118,auVar113,local_5e0);
    auVar248 = vfmadd231ps_fma(auVar114,auVar113,local_600);
    auVar44._4_4_ = fVar256 * (float)local_6a0._4_4_;
    auVar44._0_4_ = fVar170 * (float)local_6a0._0_4_;
    auVar44._8_4_ = fVar258 * fStack_698;
    auVar44._12_4_ = fVar260 * fStack_694;
    auVar44._16_4_ = fStack_690 * 0.0;
    auVar44._20_4_ = fStack_68c * 0.0;
    auVar44._24_4_ = fStack_688 * 0.0;
    auVar44._28_4_ = fStack_584;
    auVar45._4_4_ = fVar256 * (float)local_6c0._4_4_;
    auVar45._0_4_ = fVar170 * (float)local_6c0._0_4_;
    auVar45._8_4_ = fVar258 * fStack_6b8;
    auVar45._12_4_ = fVar260 * fStack_6b4;
    auVar45._16_4_ = fStack_6b0 * 0.0;
    auVar45._20_4_ = fStack_6ac * 0.0;
    auVar45._24_4_ = fStack_6a8 * 0.0;
    auVar45._28_4_ = local_5c0._28_4_;
    auVar46._4_4_ = fVar256 * (float)local_6e0._4_4_;
    auVar46._0_4_ = fVar170 * (float)local_6e0._0_4_;
    auVar46._8_4_ = fVar258 * fStack_6d8;
    auVar46._12_4_ = fVar260 * fStack_6d4;
    auVar46._16_4_ = fStack_6d0 * 0.0;
    auVar46._20_4_ = fStack_6cc * 0.0;
    auVar46._24_4_ = fStack_6c8 * 0.0;
    auVar46._28_4_ = local_5e0._28_4_;
    auVar47._4_4_ = fVar256 * (float)local_700._4_4_;
    auVar47._0_4_ = fVar170 * (float)local_700._0_4_;
    auVar47._8_4_ = fVar258 * fStack_6f8;
    auVar47._12_4_ = fVar260 * fStack_6f4;
    auVar47._16_4_ = fStack_6f0 * 0.0;
    auVar47._20_4_ = fStack_6ec * 0.0;
    auVar47._24_4_ = fStack_6e8 * 0.0;
    auVar47._28_4_ = local_600._28_4_;
    auVar116 = vfmadd231ps_avx512vl(auVar44,auVar113,auVar83);
    auVar117 = vfmadd231ps_avx512vl(auVar45,auVar113,local_640);
    auVar118 = vfmadd231ps_avx512vl(auVar46,auVar113,local_660);
    auVar114 = vfmadd231ps_avx512vl(auVar47,auVar113,local_680);
    auVar119 = vmulps_avx512vl(auVar122,ZEXT1632(auVar100));
    auVar120 = vmulps_avx512vl(auVar122,ZEXT1632(auVar107));
    auVar121 = vmulps_avx512vl(auVar122,ZEXT1632(auVar108));
    auVar122 = vmulps_avx512vl(auVar122,ZEXT1632(auVar248));
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar113,ZEXT1632(auVar103));
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar113,ZEXT1632(auVar104));
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar113,ZEXT1632(auVar105));
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar113,ZEXT1632(auVar106));
    auVar207._0_4_ = auVar116._0_4_ * fVar170;
    auVar207._4_4_ = auVar116._4_4_ * fVar256;
    auVar207._8_4_ = auVar116._8_4_ * fVar258;
    auVar207._12_4_ = auVar116._12_4_ * fVar260;
    auVar207._16_4_ = auVar116._16_4_ * 0.0;
    auVar207._20_4_ = auVar116._20_4_ * 0.0;
    auVar207._24_4_ = auVar116._24_4_ * 0.0;
    auVar207._28_4_ = 0;
    auVar48._4_4_ = auVar117._4_4_ * fVar256;
    auVar48._0_4_ = auVar117._0_4_ * fVar170;
    auVar48._8_4_ = auVar117._8_4_ * fVar258;
    auVar48._12_4_ = auVar117._12_4_ * fVar260;
    auVar48._16_4_ = auVar117._16_4_ * 0.0;
    auVar48._20_4_ = auVar117._20_4_ * 0.0;
    auVar48._24_4_ = auVar117._24_4_ * 0.0;
    auVar48._28_4_ = auVar116._28_4_;
    auVar49._4_4_ = auVar118._4_4_ * fVar256;
    auVar49._0_4_ = auVar118._0_4_ * fVar170;
    auVar49._8_4_ = auVar118._8_4_ * fVar258;
    auVar49._12_4_ = auVar118._12_4_ * fVar260;
    auVar49._16_4_ = auVar118._16_4_ * 0.0;
    auVar49._20_4_ = auVar118._20_4_ * 0.0;
    auVar49._24_4_ = auVar118._24_4_ * 0.0;
    auVar49._28_4_ = auVar117._28_4_;
    auVar50._4_4_ = auVar114._4_4_ * fVar256;
    auVar50._0_4_ = auVar114._0_4_ * fVar170;
    auVar50._8_4_ = auVar114._8_4_ * fVar258;
    auVar50._12_4_ = auVar114._12_4_ * fVar260;
    auVar50._16_4_ = auVar114._16_4_ * 0.0;
    auVar50._20_4_ = auVar114._20_4_ * 0.0;
    auVar50._24_4_ = auVar114._24_4_ * 0.0;
    auVar50._28_4_ = auVar118._28_4_;
    auVar103 = vfmadd231ps_fma(auVar207,auVar113,ZEXT1632(auVar100));
    auVar104 = vfmadd231ps_fma(auVar48,auVar113,ZEXT1632(auVar107));
    auVar105 = vfmadd231ps_fma(auVar49,auVar113,ZEXT1632(auVar108));
    auVar106 = vfmadd231ps_fma(auVar50,auVar113,ZEXT1632(auVar248));
    auVar116 = vmulps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar105));
    auVar114 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar260 * auVar103._12_4_,
                                             CONCAT48(fVar258 * auVar103._8_4_,
                                                      CONCAT44(fVar256 * auVar103._4_4_,
                                                               fVar170 * auVar103._0_4_)))),auVar113
                          ,auVar119);
    auVar247 = ZEXT3264(auVar114);
    auVar112 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar104._12_4_ * fVar260,
                                             CONCAT48(auVar104._8_4_ * fVar258,
                                                      CONCAT44(auVar104._4_4_ * fVar256,
                                                               auVar104._0_4_ * fVar170)))),auVar113
                          ,auVar120);
    auVar123 = vfmadd231ps_avx512vl(auVar116,auVar113,auVar121);
    auVar117 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar106._12_4_ * fVar260,
                                             CONCAT48(auVar106._8_4_ * fVar258,
                                                      CONCAT44(auVar106._4_4_ * fVar256,
                                                               auVar106._0_4_ * fVar170)))),auVar122
                          ,auVar113);
    auVar113 = vsubps_avx512vl(ZEXT1632(auVar103),auVar119);
    auVar116 = vsubps_avx512vl(ZEXT1632(auVar104),auVar120);
    auVar118 = vsubps_avx512vl(ZEXT1632(auVar105),auVar121);
    auVar119 = vsubps_avx512vl(ZEXT1632(auVar106),auVar122);
    auVar268._0_4_ = fVar267 * auVar113._0_4_ * 3.0;
    auVar268._4_4_ = fVar267 * auVar113._4_4_ * 3.0;
    auVar268._8_4_ = fVar267 * auVar113._8_4_ * 3.0;
    auVar268._12_4_ = fVar267 * auVar113._12_4_ * 3.0;
    auVar268._16_4_ = fVar267 * auVar113._16_4_ * 3.0;
    auVar268._20_4_ = fVar267 * auVar113._20_4_ * 3.0;
    auVar268._24_4_ = fVar267 * auVar113._24_4_ * 3.0;
    auVar268._28_4_ = 0;
    auVar270._0_4_ = fVar267 * auVar116._0_4_ * 3.0;
    auVar270._4_4_ = fVar267 * auVar116._4_4_ * 3.0;
    auVar270._8_4_ = fVar267 * auVar116._8_4_ * 3.0;
    auVar270._12_4_ = fVar267 * auVar116._12_4_ * 3.0;
    auVar270._16_4_ = fVar267 * auVar116._16_4_ * 3.0;
    auVar270._20_4_ = fVar267 * auVar116._20_4_ * 3.0;
    auVar270._24_4_ = fVar267 * auVar116._24_4_ * 3.0;
    auVar270._28_4_ = 0;
    auVar271._0_4_ = auVar118._0_4_ * 3.0 * fVar267;
    auVar271._4_4_ = auVar118._4_4_ * 3.0 * fVar267;
    auVar271._8_4_ = auVar118._8_4_ * 3.0 * fVar267;
    auVar271._12_4_ = auVar118._12_4_ * 3.0 * fVar267;
    auVar271._16_4_ = auVar118._16_4_ * 3.0 * fVar267;
    auVar271._20_4_ = auVar118._20_4_ * 3.0 * fVar267;
    auVar271._24_4_ = auVar118._24_4_ * 3.0 * fVar267;
    auVar271._28_4_ = 0;
    fVar170 = auVar119._0_4_ * 3.0 * fVar267;
    fVar256 = auVar119._4_4_ * 3.0 * fVar267;
    auVar51._4_4_ = fVar256;
    auVar51._0_4_ = fVar170;
    fVar258 = auVar119._8_4_ * 3.0 * fVar267;
    auVar51._8_4_ = fVar258;
    fVar260 = auVar119._12_4_ * 3.0 * fVar267;
    auVar51._12_4_ = fVar260;
    fVar262 = auVar119._16_4_ * 3.0 * fVar267;
    auVar51._16_4_ = fVar262;
    fVar232 = auVar119._20_4_ * 3.0 * fVar267;
    auVar51._20_4_ = fVar232;
    fVar263 = auVar119._24_4_ * 3.0 * fVar267;
    auVar51._24_4_ = fVar263;
    auVar51._28_4_ = fVar267;
    auVar119 = vpermt2ps_avx512vl(auVar114,_DAT_0205fd20,ZEXT1632(auVar102));
    auVar120 = vpermt2ps_avx512vl(auVar112,_DAT_0205fd20,ZEXT1632(auVar102));
    auVar118 = ZEXT1632(auVar102);
    auVar121 = vpermt2ps_avx512vl(auVar123,_DAT_0205fd20,auVar118);
    auVar208._0_4_ = auVar117._0_4_ + fVar170;
    auVar208._4_4_ = auVar117._4_4_ + fVar256;
    auVar208._8_4_ = auVar117._8_4_ + fVar258;
    auVar208._12_4_ = auVar117._12_4_ + fVar260;
    auVar208._16_4_ = auVar117._16_4_ + fVar262;
    auVar208._20_4_ = auVar117._20_4_ + fVar232;
    auVar208._24_4_ = auVar117._24_4_ + fVar263;
    auVar208._28_4_ = auVar117._28_4_ + fVar267;
    auVar113 = vmaxps_avx(auVar117,auVar208);
    auVar116 = vminps_avx(auVar117,auVar208);
    auVar122 = vpermt2ps_avx512vl(auVar117,_DAT_0205fd20,auVar118);
    auVar124 = vpermt2ps_avx512vl(auVar268,_DAT_0205fd20,auVar118);
    auVar110 = vpermt2ps_avx512vl(auVar270,_DAT_0205fd20,auVar118);
    auVar136 = ZEXT1632(auVar102);
    auVar111 = vpermt2ps_avx512vl(auVar271,_DAT_0205fd20,auVar136);
    auVar117 = vpermt2ps_avx512vl(auVar51,_DAT_0205fd20,auVar136);
    auVar125 = vsubps_avx512vl(auVar122,auVar117);
    auVar117 = vsubps_avx(auVar119,auVar114);
    auVar118 = vsubps_avx(auVar120,auVar112);
    auVar126 = vsubps_avx512vl(auVar121,auVar123);
    auVar127 = vmulps_avx512vl(auVar118,auVar271);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar270,auVar126);
    auVar128 = vmulps_avx512vl(auVar126,auVar268);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar271,auVar117);
    auVar129 = vmulps_avx512vl(auVar117,auVar270);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar268,auVar118);
    auVar129 = vmulps_avx512vl(auVar129,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar128);
    auVar127 = vfmadd231ps_avx512vl(auVar128,auVar127,auVar127);
    auVar128 = vmulps_avx512vl(auVar126,auVar126);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar118,auVar118);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar117,auVar117);
    auVar129 = vrcp14ps_avx512vl(auVar128);
    auVar130 = vfnmadd213ps_avx512vl(auVar129,auVar128,auVar179);
    auVar129 = vfmadd132ps_avx512vl(auVar130,auVar129,auVar129);
    auVar127 = vmulps_avx512vl(auVar127,auVar129);
    auVar130 = vmulps_avx512vl(auVar118,auVar111);
    auVar130 = vfmsub231ps_avx512vl(auVar130,auVar110,auVar126);
    auVar131 = vmulps_avx512vl(auVar126,auVar124);
    auVar131 = vfmsub231ps_avx512vl(auVar131,auVar111,auVar117);
    auVar132 = vmulps_avx512vl(auVar117,auVar110);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar124,auVar118);
    auVar132 = vmulps_avx512vl(auVar132,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar131,auVar131);
    auVar130 = vfmadd231ps_avx512vl(auVar131,auVar130,auVar130);
    auVar129 = vmulps_avx512vl(auVar130,auVar129);
    auVar127 = vmaxps_avx512vl(auVar127,auVar129);
    auVar127 = vsqrtps_avx512vl(auVar127);
    auVar129 = vmaxps_avx512vl(auVar125,auVar122);
    auVar113 = vmaxps_avx512vl(auVar113,auVar129);
    auVar129 = vaddps_avx512vl(auVar127,auVar113);
    auVar113 = vminps_avx512vl(auVar125,auVar122);
    auVar113 = vminps_avx(auVar116,auVar113);
    auVar113 = vsubps_avx512vl(auVar113,auVar127);
    auVar141._8_4_ = 0x3f800002;
    auVar141._0_8_ = 0x3f8000023f800002;
    auVar141._12_4_ = 0x3f800002;
    auVar141._16_4_ = 0x3f800002;
    auVar141._20_4_ = 0x3f800002;
    auVar141._24_4_ = 0x3f800002;
    auVar141._28_4_ = 0x3f800002;
    auVar116 = vmulps_avx512vl(auVar129,auVar141);
    auVar142._8_4_ = 0x3f7ffffc;
    auVar142._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar142._12_4_ = 0x3f7ffffc;
    auVar142._16_4_ = 0x3f7ffffc;
    auVar142._20_4_ = 0x3f7ffffc;
    auVar142._24_4_ = 0x3f7ffffc;
    auVar142._28_4_ = 0x3f7ffffc;
    local_a80 = vmulps_avx512vl(auVar113,auVar142);
    auVar52._4_4_ = auVar116._4_4_ * auVar116._4_4_;
    auVar52._0_4_ = auVar116._0_4_ * auVar116._0_4_;
    auVar52._8_4_ = auVar116._8_4_ * auVar116._8_4_;
    auVar52._12_4_ = auVar116._12_4_ * auVar116._12_4_;
    auVar52._16_4_ = auVar116._16_4_ * auVar116._16_4_;
    auVar52._20_4_ = auVar116._20_4_ * auVar116._20_4_;
    auVar52._24_4_ = auVar116._24_4_ * auVar116._24_4_;
    auVar52._28_4_ = local_a80._28_4_;
    auVar113 = vrsqrt14ps_avx512vl(auVar128);
    auVar143._8_4_ = 0xbf000000;
    auVar143._0_8_ = 0xbf000000bf000000;
    auVar143._12_4_ = 0xbf000000;
    auVar143._16_4_ = 0xbf000000;
    auVar143._20_4_ = 0xbf000000;
    auVar143._24_4_ = 0xbf000000;
    auVar143._28_4_ = 0xbf000000;
    auVar116 = vmulps_avx512vl(auVar128,auVar143);
    auVar53._4_4_ = auVar113._4_4_ * auVar116._4_4_;
    auVar53._0_4_ = auVar113._0_4_ * auVar116._0_4_;
    auVar53._8_4_ = auVar113._8_4_ * auVar116._8_4_;
    auVar53._12_4_ = auVar113._12_4_ * auVar116._12_4_;
    auVar53._16_4_ = auVar113._16_4_ * auVar116._16_4_;
    auVar53._20_4_ = auVar113._20_4_ * auVar116._20_4_;
    auVar53._24_4_ = auVar113._24_4_ * auVar116._24_4_;
    auVar53._28_4_ = auVar116._28_4_;
    auVar116 = vmulps_avx512vl(auVar113,auVar113);
    auVar116 = vmulps_avx512vl(auVar116,auVar53);
    auVar31._8_4_ = 0x3fc00000;
    auVar31._0_8_ = 0x3fc000003fc00000;
    auVar31._12_4_ = 0x3fc00000;
    auVar31._16_4_ = 0x3fc00000;
    auVar31._20_4_ = 0x3fc00000;
    auVar31._24_4_ = 0x3fc00000;
    auVar31._28_4_ = 0x3fc00000;
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar113,auVar31);
    auVar54._4_4_ = auVar116._4_4_ * auVar117._4_4_;
    auVar54._0_4_ = auVar116._0_4_ * auVar117._0_4_;
    auVar54._8_4_ = auVar116._8_4_ * auVar117._8_4_;
    auVar54._12_4_ = auVar116._12_4_ * auVar117._12_4_;
    auVar54._16_4_ = auVar116._16_4_ * auVar117._16_4_;
    auVar54._20_4_ = auVar116._20_4_ * auVar117._20_4_;
    auVar54._24_4_ = auVar116._24_4_ * auVar117._24_4_;
    auVar54._28_4_ = auVar113._28_4_;
    auVar113 = vmulps_avx512vl(auVar118,auVar116);
    auVar122 = vmulps_avx512vl(auVar126,auVar116);
    auVar125 = vsubps_avx512vl(auVar136,auVar114);
    auVar127 = vsubps_avx512vl(auVar136,auVar112);
    auVar128 = vsubps_avx512vl(auVar136,auVar123);
    auVar129 = vmulps_avx512vl(auVar272._0_32_,auVar128);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar155._0_32_,auVar127);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar115,auVar125);
    auVar130 = vmulps_avx512vl(auVar128,auVar128);
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar127,auVar127);
    auVar130 = vfmadd231ps_avx512vl(auVar130,auVar125,auVar125);
    auVar131 = vmulps_avx512vl(auVar272._0_32_,auVar122);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar113,auVar155._0_32_);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar54,auVar115);
    auVar122 = vmulps_avx512vl(auVar128,auVar122);
    auVar113 = vfmadd231ps_avx512vl(auVar122,auVar127,auVar113);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar125,auVar54);
    local_8e0 = vmulps_avx512vl(auVar131,auVar131);
    auVar122 = vsubps_avx512vl(local_720,local_8e0);
    auVar132 = vmulps_avx512vl(auVar131,auVar113);
    auVar129 = vsubps_avx512vl(auVar129,auVar132);
    auVar129 = vaddps_avx512vl(auVar129,auVar129);
    auVar132 = vmulps_avx512vl(auVar113,auVar113);
    auVar130 = vsubps_avx512vl(auVar130,auVar132);
    auVar132 = vsubps_avx512vl(auVar130,auVar52);
    auVar133 = vmulps_avx512vl(auVar129,auVar129);
    auVar32._8_4_ = 0x40800000;
    auVar32._0_8_ = 0x4080000040800000;
    auVar32._12_4_ = 0x40800000;
    auVar32._16_4_ = 0x40800000;
    auVar32._20_4_ = 0x40800000;
    auVar32._24_4_ = 0x40800000;
    auVar32._28_4_ = 0x40800000;
    auVar134 = vmulps_avx512vl(auVar122,auVar32);
    auVar135 = vmulps_avx512vl(auVar134,auVar132);
    auVar135 = vsubps_avx512vl(auVar133,auVar135);
    auVar99 = vxorps_avx512vl(auVar130._0_16_,auVar130._0_16_);
    uVar97 = vcmpps_avx512vl(auVar135,auVar136,5);
    bVar86 = (byte)uVar97;
    if (bVar86 == 0) {
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar135 = vsqrtps_avx512vl(auVar135);
      auVar136 = vaddps_avx512vl(auVar122,auVar122);
      auVar137 = vrcp14ps_avx512vl(auVar136);
      auVar136 = vfnmadd213ps_avx512vl(auVar136,auVar137,auVar179);
      auVar136 = vfmadd132ps_avx512vl(auVar136,auVar137,auVar137);
      auVar33._8_4_ = 0x80000000;
      auVar33._0_8_ = 0x8000000080000000;
      auVar33._12_4_ = 0x80000000;
      auVar33._16_4_ = 0x80000000;
      auVar33._20_4_ = 0x80000000;
      auVar33._24_4_ = 0x80000000;
      auVar33._28_4_ = 0x80000000;
      auVar137 = vxorps_avx512vl(auVar129,auVar33);
      auVar137 = vsubps_avx512vl(auVar137,auVar135);
      auVar137 = vmulps_avx512vl(auVar137,auVar136);
      auVar135 = vsubps_avx512vl(auVar135,auVar129);
      auVar135 = vmulps_avx512vl(auVar135,auVar136);
      auVar136 = vfmadd213ps_avx512vl(auVar131,auVar137,auVar113);
      local_820 = vmulps_avx512vl(auVar116,auVar136);
      auVar136 = vfmadd213ps_avx512vl(auVar131,auVar135,auVar113);
      local_840 = vmulps_avx512vl(auVar116,auVar136);
      auVar180._8_4_ = 0x7f800000;
      auVar180._0_8_ = 0x7f8000007f800000;
      auVar180._12_4_ = 0x7f800000;
      auVar180._16_4_ = 0x7f800000;
      auVar180._20_4_ = 0x7f800000;
      auVar180._24_4_ = 0x7f800000;
      auVar180._28_4_ = 0x7f800000;
      auVar136 = vblendmps_avx512vl(auVar180,auVar137);
      auVar138._0_4_ =
           (uint)(bVar86 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar86 & 1) * local_840._0_4_;
      bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar138._4_4_ = (uint)bVar5 * auVar136._4_4_ | (uint)!bVar5 * local_840._4_4_;
      bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar138._8_4_ = (uint)bVar5 * auVar136._8_4_ | (uint)!bVar5 * local_840._8_4_;
      bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar138._12_4_ = (uint)bVar5 * auVar136._12_4_ | (uint)!bVar5 * local_840._12_4_;
      bVar5 = (bool)((byte)(uVar97 >> 4) & 1);
      auVar138._16_4_ = (uint)bVar5 * auVar136._16_4_ | (uint)!bVar5 * local_840._16_4_;
      bVar5 = (bool)((byte)(uVar97 >> 5) & 1);
      auVar138._20_4_ = (uint)bVar5 * auVar136._20_4_ | (uint)!bVar5 * local_840._20_4_;
      bVar5 = (bool)((byte)(uVar97 >> 6) & 1);
      auVar138._24_4_ = (uint)bVar5 * auVar136._24_4_ | (uint)!bVar5 * local_840._24_4_;
      bVar5 = SUB81(uVar97 >> 7,0);
      auVar138._28_4_ = (uint)bVar5 * auVar136._28_4_ | (uint)!bVar5 * local_840._28_4_;
      auVar181._8_4_ = 0xff800000;
      auVar181._0_8_ = 0xff800000ff800000;
      auVar181._12_4_ = 0xff800000;
      auVar181._16_4_ = 0xff800000;
      auVar181._20_4_ = 0xff800000;
      auVar181._24_4_ = 0xff800000;
      auVar181._28_4_ = 0xff800000;
      auVar136 = vblendmps_avx512vl(auVar181,auVar135);
      auVar139._0_4_ =
           (uint)(bVar86 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar135._0_4_;
      bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
      auVar139._4_4_ = (uint)bVar5 * auVar136._4_4_ | (uint)!bVar5 * auVar135._4_4_;
      bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
      auVar139._8_4_ = (uint)bVar5 * auVar136._8_4_ | (uint)!bVar5 * auVar135._8_4_;
      bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
      auVar139._12_4_ = (uint)bVar5 * auVar136._12_4_ | (uint)!bVar5 * auVar135._12_4_;
      bVar5 = (bool)((byte)(uVar97 >> 4) & 1);
      auVar139._16_4_ = (uint)bVar5 * auVar136._16_4_ | (uint)!bVar5 * auVar135._16_4_;
      bVar5 = (bool)((byte)(uVar97 >> 5) & 1);
      auVar139._20_4_ = (uint)bVar5 * auVar136._20_4_ | (uint)!bVar5 * auVar135._20_4_;
      bVar5 = (bool)((byte)(uVar97 >> 6) & 1);
      auVar139._24_4_ = (uint)bVar5 * auVar136._24_4_ | (uint)!bVar5 * auVar135._24_4_;
      bVar5 = SUB81(uVar97 >> 7,0);
      auVar139._28_4_ = (uint)bVar5 * auVar136._28_4_ | (uint)!bVar5 * auVar135._28_4_;
      auVar182._8_4_ = 0x7fffffff;
      auVar182._0_8_ = 0x7fffffff7fffffff;
      auVar182._12_4_ = 0x7fffffff;
      auVar182._16_4_ = 0x7fffffff;
      auVar182._20_4_ = 0x7fffffff;
      auVar182._24_4_ = 0x7fffffff;
      auVar182._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_8e0,auVar182);
      auVar135 = vmaxps_avx512vl(local_7e0,local_8e0);
      auVar34._8_4_ = 0x36000000;
      auVar34._0_8_ = 0x3600000036000000;
      auVar34._12_4_ = 0x36000000;
      auVar34._16_4_ = 0x36000000;
      auVar34._20_4_ = 0x36000000;
      auVar34._24_4_ = 0x36000000;
      auVar34._28_4_ = 0x36000000;
      auVar136 = vmulps_avx512vl(auVar135,auVar34);
      auVar135 = vandps_avx(auVar122,auVar182);
      uVar89 = vcmpps_avx512vl(auVar135,auVar136,1);
      uVar97 = uVar97 & uVar89;
      bVar93 = (byte)uVar97;
      if (bVar93 != 0) {
        uVar89 = vcmpps_avx512vl(auVar132,ZEXT1632(auVar99),2);
        auVar214._8_4_ = 0xff800000;
        auVar214._0_8_ = 0xff800000ff800000;
        auVar214._12_4_ = 0xff800000;
        auVar214._16_4_ = 0xff800000;
        auVar214._20_4_ = 0xff800000;
        auVar214._24_4_ = 0xff800000;
        auVar214._28_4_ = 0xff800000;
        auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar136 = vblendmps_avx512vl(auVar132,auVar214);
        bVar90 = (byte)uVar89;
        uVar98 = (uint)(bVar90 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar135._0_4_;
        bVar5 = (bool)((byte)(uVar89 >> 1) & 1);
        uVar163 = (uint)bVar5 * auVar136._4_4_ | (uint)!bVar5 * auVar135._4_4_;
        bVar5 = (bool)((byte)(uVar89 >> 2) & 1);
        uVar164 = (uint)bVar5 * auVar136._8_4_ | (uint)!bVar5 * auVar135._8_4_;
        bVar5 = (bool)((byte)(uVar89 >> 3) & 1);
        uVar165 = (uint)bVar5 * auVar136._12_4_ | (uint)!bVar5 * auVar135._12_4_;
        bVar5 = (bool)((byte)(uVar89 >> 4) & 1);
        uVar166 = (uint)bVar5 * auVar136._16_4_ | (uint)!bVar5 * auVar135._16_4_;
        bVar5 = (bool)((byte)(uVar89 >> 5) & 1);
        uVar167 = (uint)bVar5 * auVar136._20_4_ | (uint)!bVar5 * auVar135._20_4_;
        bVar5 = (bool)((byte)(uVar89 >> 6) & 1);
        uVar168 = (uint)bVar5 * auVar136._24_4_ | (uint)!bVar5 * auVar135._24_4_;
        bVar5 = SUB81(uVar89 >> 7,0);
        uVar169 = (uint)bVar5 * auVar136._28_4_ | (uint)!bVar5 * auVar135._28_4_;
        auVar138._0_4_ = (bVar93 & 1) * uVar98 | !(bool)(bVar93 & 1) * auVar138._0_4_;
        bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar138._4_4_ = bVar5 * uVar163 | !bVar5 * auVar138._4_4_;
        bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar138._8_4_ = bVar5 * uVar164 | !bVar5 * auVar138._8_4_;
        bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar138._12_4_ = bVar5 * uVar165 | !bVar5 * auVar138._12_4_;
        bVar5 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar138._16_4_ = bVar5 * uVar166 | !bVar5 * auVar138._16_4_;
        bVar5 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar138._20_4_ = bVar5 * uVar167 | !bVar5 * auVar138._20_4_;
        bVar5 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar138._24_4_ = bVar5 * uVar168 | !bVar5 * auVar138._24_4_;
        bVar5 = SUB81(uVar97 >> 7,0);
        auVar138._28_4_ = bVar5 * uVar169 | !bVar5 * auVar138._28_4_;
        auVar132 = vblendmps_avx512vl(auVar214,auVar132);
        bVar5 = (bool)((byte)(uVar89 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar89 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar89 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar89 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar89 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar89 >> 6) & 1);
        bVar11 = SUB81(uVar89 >> 7,0);
        auVar139._0_4_ =
             (uint)(bVar93 & 1) *
             ((uint)(bVar90 & 1) * auVar132._0_4_ | !(bool)(bVar90 & 1) * uVar98) |
             !(bool)(bVar93 & 1) * auVar139._0_4_;
        bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
        auVar139._4_4_ =
             (uint)bVar96 * ((uint)bVar5 * auVar132._4_4_ | !bVar5 * uVar163) |
             !bVar96 * auVar139._4_4_;
        bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
        auVar139._8_4_ =
             (uint)bVar5 * ((uint)bVar6 * auVar132._8_4_ | !bVar6 * uVar164) |
             !bVar5 * auVar139._8_4_;
        bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
        auVar139._12_4_ =
             (uint)bVar5 * ((uint)bVar7 * auVar132._12_4_ | !bVar7 * uVar165) |
             !bVar5 * auVar139._12_4_;
        bVar5 = (bool)((byte)(uVar97 >> 4) & 1);
        auVar139._16_4_ =
             (uint)bVar5 * ((uint)bVar8 * auVar132._16_4_ | !bVar8 * uVar166) |
             !bVar5 * auVar139._16_4_;
        bVar5 = (bool)((byte)(uVar97 >> 5) & 1);
        auVar139._20_4_ =
             (uint)bVar5 * ((uint)bVar9 * auVar132._20_4_ | !bVar9 * uVar167) |
             !bVar5 * auVar139._20_4_;
        bVar5 = (bool)((byte)(uVar97 >> 6) & 1);
        auVar139._24_4_ =
             (uint)bVar5 * ((uint)bVar10 * auVar132._24_4_ | !bVar10 * uVar168) |
             !bVar5 * auVar139._24_4_;
        bVar5 = SUB81(uVar97 >> 7,0);
        auVar139._28_4_ =
             (uint)bVar5 * ((uint)bVar11 * auVar132._28_4_ | !bVar11 * uVar169) |
             !bVar5 * auVar139._28_4_;
        bVar86 = (~bVar93 | bVar90) & bVar86;
      }
      auVar179._8_4_ = 0x3f800000;
      auVar179._0_8_ = &DAT_3f8000003f800000;
      auVar179._12_4_ = 0x3f800000;
      auVar179._16_4_ = 0x3f800000;
      auVar179._20_4_ = 0x3f800000;
      auVar179._24_4_ = 0x3f800000;
      auVar179._28_4_ = 0x3f800000;
    }
    in_ZMM31 = ZEXT3264(auVar139);
    if ((bVar86 & 0x7f) == 0) {
      auVar237 = ZEXT3264(_DAT_02020f20);
      auVar191._0_32_ = local_aa0;
      auVar272 = ZEXT3264(local_aa0);
    }
    else {
      fVar170 = *(float *)(ray + k * 4 + 0x200) - (float)local_a10._0_4_;
      auVar183._4_4_ = fVar170;
      auVar183._0_4_ = fVar170;
      auVar183._8_4_ = fVar170;
      auVar183._12_4_ = fVar170;
      auVar183._16_4_ = fVar170;
      auVar183._20_4_ = fVar170;
      auVar183._24_4_ = fVar170;
      auVar183._28_4_ = fVar170;
      auVar132 = vminps_avx512vl(auVar183,auVar139);
      auVar82._4_4_ = fStack_73c;
      auVar82._0_4_ = local_740;
      auVar82._8_4_ = fStack_738;
      auVar82._12_4_ = fStack_734;
      auVar82._16_4_ = fStack_730;
      auVar82._20_4_ = fStack_72c;
      auVar82._24_4_ = fStack_728;
      auVar82._28_4_ = fStack_724;
      auVar135 = vmaxps_avx512vl(auVar82,auVar138);
      auVar128 = vmulps_avx512vl(auVar128,auVar271);
      auVar127 = vfmadd213ps_avx512vl(auVar127,auVar270,auVar128);
      auVar125 = vfmadd213ps_avx512vl(auVar125,auVar268,auVar127);
      auVar272 = ZEXT3264(local_aa0);
      auVar127 = vmulps_avx512vl(local_aa0,auVar271);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar155._0_32_,auVar270);
      in_ZMM31 = ZEXT3264(auVar115);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar115,auVar268);
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar127,auVar128);
      auVar136 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar21 = vcmpps_avx512vl(auVar128,auVar136,1);
      auVar137 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar125 = vxorps_avx512vl(auVar125,auVar137);
      auVar140 = vrcp14ps_avx512vl(auVar127);
      auVar141 = vxorps_avx512vl(auVar127,auVar137);
      auVar142 = vfnmadd213ps_avx512vl(auVar140,auVar127,auVar179);
      auVar142 = vfmadd132ps_avx512vl(auVar142,auVar140,auVar140);
      auVar142 = vmulps_avx512vl(auVar142,auVar125);
      uVar23 = vcmpps_avx512vl(auVar127,auVar141,1);
      bVar93 = (byte)uVar21 | (byte)uVar23;
      auVar143 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar125 = vblendmps_avx512vl(auVar142,auVar143);
      auVar144._0_4_ =
           (uint)(bVar93 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar140._0_4_;
      bVar5 = (bool)(bVar93 >> 1 & 1);
      auVar144._4_4_ = (uint)bVar5 * auVar125._4_4_ | (uint)!bVar5 * auVar140._4_4_;
      bVar5 = (bool)(bVar93 >> 2 & 1);
      auVar144._8_4_ = (uint)bVar5 * auVar125._8_4_ | (uint)!bVar5 * auVar140._8_4_;
      bVar5 = (bool)(bVar93 >> 3 & 1);
      auVar144._12_4_ = (uint)bVar5 * auVar125._12_4_ | (uint)!bVar5 * auVar140._12_4_;
      bVar5 = (bool)(bVar93 >> 4 & 1);
      auVar144._16_4_ = (uint)bVar5 * auVar125._16_4_ | (uint)!bVar5 * auVar140._16_4_;
      bVar5 = (bool)(bVar93 >> 5 & 1);
      auVar144._20_4_ = (uint)bVar5 * auVar125._20_4_ | (uint)!bVar5 * auVar140._20_4_;
      bVar5 = (bool)(bVar93 >> 6 & 1);
      auVar144._24_4_ = (uint)bVar5 * auVar125._24_4_ | (uint)!bVar5 * auVar140._24_4_;
      auVar144._28_4_ =
           (uint)(bVar93 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar93 >> 7) * auVar140._28_4_;
      auVar125 = vmaxps_avx(auVar135,auVar144);
      uVar23 = vcmpps_avx512vl(auVar127,auVar141,6);
      bVar93 = (byte)uVar21 | (byte)uVar23;
      auVar145._0_4_ = (uint)(bVar93 & 1) * 0x7f800000 | (uint)!(bool)(bVar93 & 1) * auVar142._0_4_;
      bVar5 = (bool)(bVar93 >> 1 & 1);
      auVar145._4_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar142._4_4_;
      bVar5 = (bool)(bVar93 >> 2 & 1);
      auVar145._8_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar142._8_4_;
      bVar5 = (bool)(bVar93 >> 3 & 1);
      auVar145._12_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar142._12_4_;
      bVar5 = (bool)(bVar93 >> 4 & 1);
      auVar145._16_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar142._16_4_;
      bVar5 = (bool)(bVar93 >> 5 & 1);
      auVar145._20_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar142._20_4_;
      bVar5 = (bool)(bVar93 >> 6 & 1);
      auVar145._24_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * auVar142._24_4_;
      auVar145._28_4_ =
           (uint)(bVar93 >> 7) * 0x7f800000 | (uint)!(bool)(bVar93 >> 7) * auVar142._28_4_;
      auVar127 = vminps_avx(auVar132,auVar145);
      auVar99 = vxorps_avx512vl(auVar141._0_16_,auVar141._0_16_);
      auVar119 = vsubps_avx512vl(ZEXT1632(auVar99),auVar119);
      auVar120 = vsubps_avx512vl(ZEXT1632(auVar99),auVar120);
      auVar132 = ZEXT1632(auVar99);
      auVar121 = vsubps_avx512vl(auVar132,auVar121);
      auVar55._4_4_ = auVar121._4_4_ * auVar111._4_4_;
      auVar55._0_4_ = auVar121._0_4_ * auVar111._0_4_;
      auVar55._8_4_ = auVar121._8_4_ * auVar111._8_4_;
      auVar55._12_4_ = auVar121._12_4_ * auVar111._12_4_;
      auVar55._16_4_ = auVar121._16_4_ * auVar111._16_4_;
      auVar55._20_4_ = auVar121._20_4_ * auVar111._20_4_;
      auVar55._24_4_ = auVar121._24_4_ * auVar111._24_4_;
      auVar55._28_4_ = auVar121._28_4_;
      auVar120 = vfnmsub231ps_avx512vl(auVar55,auVar110,auVar120);
      auVar119 = vfnmadd231ps_avx512vl(auVar120,auVar124,auVar119);
      auVar120 = vmulps_avx512vl(local_aa0,auVar111);
      auVar120 = vfnmsub231ps_avx512vl(auVar120,auVar155._0_32_,auVar110);
      auVar120 = vfnmadd231ps_avx512vl(auVar120,auVar115,auVar124);
      vandps_avx512vl(auVar120,auVar128);
      uVar21 = vcmpps_avx512vl(auVar120,auVar136,1);
      auVar119 = vxorps_avx512vl(auVar119,auVar137);
      auVar121 = vrcp14ps_avx512vl(auVar120);
      auVar124 = vxorps_avx512vl(auVar120,auVar137);
      auVar111 = vfnmadd213ps_avx512vl(auVar121,auVar120,auVar179);
      auVar99 = vfmadd132ps_fma(auVar111,auVar121,auVar121);
      fVar170 = auVar99._0_4_ * auVar119._0_4_;
      fVar256 = auVar99._4_4_ * auVar119._4_4_;
      auVar56._4_4_ = fVar256;
      auVar56._0_4_ = fVar170;
      fVar258 = auVar99._8_4_ * auVar119._8_4_;
      auVar56._8_4_ = fVar258;
      fVar260 = auVar99._12_4_ * auVar119._12_4_;
      auVar56._12_4_ = fVar260;
      fVar267 = auVar119._16_4_ * 0.0;
      auVar56._16_4_ = fVar267;
      fVar262 = auVar119._20_4_ * 0.0;
      auVar56._20_4_ = fVar262;
      fVar232 = auVar119._24_4_ * 0.0;
      auVar56._24_4_ = fVar232;
      auVar56._28_4_ = auVar119._28_4_;
      uVar23 = vcmpps_avx512vl(auVar120,auVar124,1);
      bVar93 = (byte)uVar21 | (byte)uVar23;
      auVar111 = vblendmps_avx512vl(auVar56,auVar143);
      auVar146._0_4_ =
           (uint)(bVar93 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar93 & 1) * auVar121._0_4_;
      bVar5 = (bool)(bVar93 >> 1 & 1);
      auVar146._4_4_ = (uint)bVar5 * auVar111._4_4_ | (uint)!bVar5 * auVar121._4_4_;
      bVar5 = (bool)(bVar93 >> 2 & 1);
      auVar146._8_4_ = (uint)bVar5 * auVar111._8_4_ | (uint)!bVar5 * auVar121._8_4_;
      bVar5 = (bool)(bVar93 >> 3 & 1);
      auVar146._12_4_ = (uint)bVar5 * auVar111._12_4_ | (uint)!bVar5 * auVar121._12_4_;
      bVar5 = (bool)(bVar93 >> 4 & 1);
      auVar146._16_4_ = (uint)bVar5 * auVar111._16_4_ | (uint)!bVar5 * auVar121._16_4_;
      bVar5 = (bool)(bVar93 >> 5 & 1);
      auVar146._20_4_ = (uint)bVar5 * auVar111._20_4_ | (uint)!bVar5 * auVar121._20_4_;
      bVar5 = (bool)(bVar93 >> 6 & 1);
      auVar146._24_4_ = (uint)bVar5 * auVar111._24_4_ | (uint)!bVar5 * auVar121._24_4_;
      auVar146._28_4_ =
           (uint)(bVar93 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar93 >> 7) * auVar121._28_4_;
      _local_920 = vmaxps_avx(auVar125,auVar146);
      uVar23 = vcmpps_avx512vl(auVar120,auVar124,6);
      bVar93 = (byte)uVar21 | (byte)uVar23;
      auVar147._0_4_ = (uint)(bVar93 & 1) * 0x7f800000 | (uint)!(bool)(bVar93 & 1) * (int)fVar170;
      bVar5 = (bool)(bVar93 >> 1 & 1);
      auVar147._4_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar256;
      bVar5 = (bool)(bVar93 >> 2 & 1);
      auVar147._8_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar258;
      bVar5 = (bool)(bVar93 >> 3 & 1);
      auVar147._12_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar260;
      bVar5 = (bool)(bVar93 >> 4 & 1);
      auVar147._16_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar267;
      bVar5 = (bool)(bVar93 >> 5 & 1);
      auVar147._20_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar262;
      bVar5 = (bool)(bVar93 >> 6 & 1);
      auVar147._24_4_ = (uint)bVar5 * 0x7f800000 | (uint)!bVar5 * (int)fVar232;
      auVar147._28_4_ =
           (uint)(bVar93 >> 7) * 0x7f800000 | (uint)!(bool)(bVar93 >> 7) * auVar119._28_4_;
      local_7a0 = vminps_avx(auVar127,auVar147);
      uVar21 = vcmpps_avx512vl(_local_920,local_7a0,2);
      bVar86 = bVar86 & 0x7f & (byte)uVar21;
      if (bVar86 == 0) {
        auVar237 = ZEXT3264(_DAT_02020f20);
        auVar155._32_32_ = auVar191._32_32_;
        auVar191 = auVar155;
      }
      else {
        auVar121 = vmaxps_avx512vl(auVar132,local_a80);
        auVar119 = vminps_avx512vl(local_820,auVar179);
        auVar64 = ZEXT412(0);
        auVar120 = ZEXT1232(auVar64) << 0x20;
        auVar119 = vmaxps_avx(auVar119,ZEXT1232(auVar64) << 0x20);
        auVar124 = vminps_avx512vl(local_840,auVar179);
        auVar57._4_4_ = (auVar119._4_4_ + 1.0) * 0.125;
        auVar57._0_4_ = (auVar119._0_4_ + 0.0) * 0.125;
        auVar57._8_4_ = (auVar119._8_4_ + 2.0) * 0.125;
        auVar57._12_4_ = (auVar119._12_4_ + 3.0) * 0.125;
        auVar57._16_4_ = (auVar119._16_4_ + 4.0) * 0.125;
        auVar57._20_4_ = (auVar119._20_4_ + 5.0) * 0.125;
        auVar57._24_4_ = (auVar119._24_4_ + 6.0) * 0.125;
        auVar57._28_4_ = auVar119._28_4_ + 7.0;
        auVar99 = vfmadd213ps_fma(auVar57,local_a60,auVar251);
        local_820 = ZEXT1632(auVar99);
        auVar119 = vmaxps_avx(auVar124,ZEXT1232(auVar64) << 0x20);
        auVar58._4_4_ = (auVar119._4_4_ + 1.0) * 0.125;
        auVar58._0_4_ = (auVar119._0_4_ + 0.0) * 0.125;
        auVar58._8_4_ = (auVar119._8_4_ + 2.0) * 0.125;
        auVar58._12_4_ = (auVar119._12_4_ + 3.0) * 0.125;
        auVar58._16_4_ = (auVar119._16_4_ + 4.0) * 0.125;
        auVar58._20_4_ = (auVar119._20_4_ + 5.0) * 0.125;
        auVar58._24_4_ = (auVar119._24_4_ + 6.0) * 0.125;
        auVar58._28_4_ = auVar119._28_4_ + 7.0;
        auVar99 = vfmadd213ps_fma(auVar58,local_a60,auVar251);
        local_840 = ZEXT1632(auVar99);
        auVar184._0_4_ = auVar121._0_4_ * auVar121._0_4_;
        auVar184._4_4_ = auVar121._4_4_ * auVar121._4_4_;
        auVar184._8_4_ = auVar121._8_4_ * auVar121._8_4_;
        auVar184._12_4_ = auVar121._12_4_ * auVar121._12_4_;
        auVar184._16_4_ = auVar121._16_4_ * auVar121._16_4_;
        auVar184._20_4_ = auVar121._20_4_ * auVar121._20_4_;
        auVar184._24_4_ = auVar121._24_4_ * auVar121._24_4_;
        auVar184._28_4_ = 0;
        auVar119 = vsubps_avx(auVar130,auVar184);
        auVar121 = vmulps_avx512vl(auVar134,auVar119);
        auVar121 = vsubps_avx512vl(auVar133,auVar121);
        uVar21 = vcmpps_avx512vl(auVar121,ZEXT1232(auVar64) << 0x20,5);
        bVar93 = (byte)uVar21;
        if (bVar93 == 0) {
          auVar113 = ZEXT832(0) << 0x20;
          auVar116 = ZEXT832(0) << 0x20;
          auVar124 = ZEXT832(0) << 0x20;
          auVar110 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar121 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar148._8_4_ = 0x7f800000;
          auVar148._0_8_ = 0x7f8000007f800000;
          auVar148._12_4_ = 0x7f800000;
          auVar148._16_4_ = 0x7f800000;
          auVar148._20_4_ = 0x7f800000;
          auVar148._24_4_ = 0x7f800000;
          auVar148._28_4_ = 0x7f800000;
          auVar149._8_4_ = 0xff800000;
          auVar149._0_8_ = 0xff800000ff800000;
          auVar149._12_4_ = 0xff800000;
          auVar149._16_4_ = 0xff800000;
          auVar149._20_4_ = 0xff800000;
          auVar149._24_4_ = 0xff800000;
          auVar149._28_4_ = 0xff800000;
        }
        else {
          auVar103 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
          uVar97 = vcmpps_avx512vl(auVar121,auVar132,5);
          auVar120 = vsqrtps_avx(auVar121);
          auVar209._0_4_ = auVar122._0_4_ + auVar122._0_4_;
          auVar209._4_4_ = auVar122._4_4_ + auVar122._4_4_;
          auVar209._8_4_ = auVar122._8_4_ + auVar122._8_4_;
          auVar209._12_4_ = auVar122._12_4_ + auVar122._12_4_;
          auVar209._16_4_ = auVar122._16_4_ + auVar122._16_4_;
          auVar209._20_4_ = auVar122._20_4_ + auVar122._20_4_;
          auVar209._24_4_ = auVar122._24_4_ + auVar122._24_4_;
          auVar209._28_4_ = auVar122._28_4_ + auVar122._28_4_;
          auVar121 = vrcp14ps_avx512vl(auVar209);
          auVar124 = vfnmadd213ps_avx512vl(auVar209,auVar121,auVar179);
          auVar99 = vfmadd132ps_fma(auVar124,auVar121,auVar121);
          auVar35._8_4_ = 0x80000000;
          auVar35._0_8_ = 0x8000000080000000;
          auVar35._12_4_ = 0x80000000;
          auVar35._16_4_ = 0x80000000;
          auVar35._20_4_ = 0x80000000;
          auVar35._24_4_ = 0x80000000;
          auVar35._28_4_ = 0x80000000;
          auVar121 = vxorps_avx512vl(auVar129,auVar35);
          auVar121 = vsubps_avx(auVar121,auVar120);
          auVar59._4_4_ = auVar121._4_4_ * auVar99._4_4_;
          auVar59._0_4_ = auVar121._0_4_ * auVar99._0_4_;
          auVar59._8_4_ = auVar121._8_4_ * auVar99._8_4_;
          auVar59._12_4_ = auVar121._12_4_ * auVar99._12_4_;
          auVar59._16_4_ = auVar121._16_4_ * 0.0;
          auVar59._20_4_ = auVar121._20_4_ * 0.0;
          auVar59._24_4_ = auVar121._24_4_ * 0.0;
          auVar59._28_4_ = 0x3e000000;
          auVar120 = vsubps_avx512vl(auVar120,auVar129);
          auVar60._4_4_ = auVar120._4_4_ * auVar99._4_4_;
          auVar60._0_4_ = auVar120._0_4_ * auVar99._0_4_;
          auVar60._8_4_ = auVar120._8_4_ * auVar99._8_4_;
          auVar60._12_4_ = auVar120._12_4_ * auVar99._12_4_;
          auVar60._16_4_ = auVar120._16_4_ * 0.0;
          auVar60._20_4_ = auVar120._20_4_ * 0.0;
          auVar60._24_4_ = auVar120._24_4_ * 0.0;
          auVar60._28_4_ = fVar192;
          auVar120 = vfmadd213ps_avx512vl(auVar131,auVar59,auVar113);
          auVar61._4_4_ = auVar116._4_4_ * auVar120._4_4_;
          auVar61._0_4_ = auVar116._0_4_ * auVar120._0_4_;
          auVar61._8_4_ = auVar116._8_4_ * auVar120._8_4_;
          auVar61._12_4_ = auVar116._12_4_ * auVar120._12_4_;
          auVar61._16_4_ = auVar116._16_4_ * auVar120._16_4_;
          auVar61._20_4_ = auVar116._20_4_ * auVar120._20_4_;
          auVar61._24_4_ = auVar116._24_4_ * auVar120._24_4_;
          auVar61._28_4_ = auVar121._28_4_;
          auVar120 = vmulps_avx512vl(auVar115,auVar59);
          auVar121 = vmulps_avx512vl(auVar155._0_32_,auVar59);
          auVar111 = vmulps_avx512vl(local_aa0,auVar59);
          auVar124 = vfmadd213ps_avx512vl(auVar117,auVar61,auVar114);
          auVar124 = vsubps_avx512vl(auVar120,auVar124);
          auVar120 = vfmadd213ps_avx512vl(auVar118,auVar61,auVar112);
          auVar110 = vsubps_avx512vl(auVar121,auVar120);
          auVar99 = vfmadd213ps_fma(auVar61,auVar126,auVar123);
          auVar121 = vsubps_avx(auVar111,ZEXT1632(auVar99));
          auVar113 = vfmadd213ps_avx512vl(auVar131,auVar60,auVar113);
          auVar116 = vmulps_avx512vl(auVar116,auVar113);
          auVar113 = vmulps_avx512vl(auVar115,auVar60);
          auVar111 = vmulps_avx512vl(auVar155._0_32_,auVar60);
          auVar125 = vmulps_avx512vl(local_aa0,auVar60);
          auVar99 = vfmadd213ps_fma(auVar117,auVar116,auVar114);
          auVar120 = vsubps_avx(auVar113,ZEXT1632(auVar99));
          auVar99 = vfmadd213ps_fma(auVar118,auVar116,auVar112);
          auVar113 = vsubps_avx512vl(auVar111,ZEXT1632(auVar99));
          auVar99 = vfmadd213ps_fma(auVar126,auVar116,auVar123);
          auVar116 = vsubps_avx512vl(auVar125,ZEXT1632(auVar99));
          auVar227._8_4_ = 0x7f800000;
          auVar227._0_8_ = 0x7f8000007f800000;
          auVar227._12_4_ = 0x7f800000;
          auVar227._16_4_ = 0x7f800000;
          auVar227._20_4_ = 0x7f800000;
          auVar227._24_4_ = 0x7f800000;
          auVar227._28_4_ = 0x7f800000;
          auVar117 = vblendmps_avx512vl(auVar227,auVar59);
          bVar5 = (bool)((byte)uVar97 & 1);
          auVar148._0_4_ = (uint)bVar5 * auVar117._0_4_ | (uint)!bVar5 * auVar114._0_4_;
          bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar148._4_4_ = (uint)bVar5 * auVar117._4_4_ | (uint)!bVar5 * auVar114._4_4_;
          bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar148._8_4_ = (uint)bVar5 * auVar117._8_4_ | (uint)!bVar5 * auVar114._8_4_;
          bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar148._12_4_ = (uint)bVar5 * auVar117._12_4_ | (uint)!bVar5 * auVar114._12_4_;
          bVar5 = (bool)((byte)(uVar97 >> 4) & 1);
          auVar148._16_4_ = (uint)bVar5 * auVar117._16_4_ | (uint)!bVar5 * auVar114._16_4_;
          bVar5 = (bool)((byte)(uVar97 >> 5) & 1);
          auVar148._20_4_ = (uint)bVar5 * auVar117._20_4_ | (uint)!bVar5 * auVar114._20_4_;
          bVar5 = (bool)((byte)(uVar97 >> 6) & 1);
          auVar148._24_4_ = (uint)bVar5 * auVar117._24_4_ | (uint)!bVar5 * auVar114._24_4_;
          bVar5 = SUB81(uVar97 >> 7,0);
          auVar148._28_4_ = (uint)bVar5 * auVar117._28_4_ | (uint)!bVar5 * auVar114._28_4_;
          auVar228._8_4_ = 0xff800000;
          auVar228._0_8_ = 0xff800000ff800000;
          auVar228._12_4_ = 0xff800000;
          auVar228._16_4_ = 0xff800000;
          auVar228._20_4_ = 0xff800000;
          auVar228._24_4_ = 0xff800000;
          auVar228._28_4_ = 0xff800000;
          auVar117 = vblendmps_avx512vl(auVar228,auVar60);
          bVar5 = (bool)((byte)uVar97 & 1);
          auVar149._0_4_ = (uint)bVar5 * auVar117._0_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar149._4_4_ = (uint)bVar5 * auVar117._4_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar149._8_4_ = (uint)bVar5 * auVar117._8_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar149._12_4_ = (uint)bVar5 * auVar117._12_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar97 >> 4) & 1);
          auVar149._16_4_ = (uint)bVar5 * auVar117._16_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar97 >> 5) & 1);
          auVar149._20_4_ = (uint)bVar5 * auVar117._20_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = (bool)((byte)(uVar97 >> 6) & 1);
          auVar149._24_4_ = (uint)bVar5 * auVar117._24_4_ | (uint)!bVar5 * -0x800000;
          bVar5 = SUB81(uVar97 >> 7,0);
          auVar149._28_4_ = (uint)bVar5 * auVar117._28_4_ | (uint)!bVar5 * -0x800000;
          auVar264._8_4_ = 0x7fffffff;
          auVar264._0_8_ = 0x7fffffff7fffffff;
          auVar264._12_4_ = 0x7fffffff;
          auVar264._16_4_ = 0x7fffffff;
          auVar264._20_4_ = 0x7fffffff;
          auVar264._24_4_ = 0x7fffffff;
          auVar264._28_4_ = 0x7fffffff;
          auVar117 = vandps_avx(auVar264,local_8e0);
          auVar117 = vmaxps_avx(local_7e0,auVar117);
          auVar36._8_4_ = 0x36000000;
          auVar36._0_8_ = 0x3600000036000000;
          auVar36._12_4_ = 0x36000000;
          auVar36._16_4_ = 0x36000000;
          auVar36._20_4_ = 0x36000000;
          auVar36._24_4_ = 0x36000000;
          auVar36._28_4_ = 0x36000000;
          auVar118 = vmulps_avx512vl(auVar117,auVar36);
          auVar117 = vandps_avx(auVar122,auVar264);
          uVar89 = vcmpps_avx512vl(auVar117,auVar118,1);
          uVar97 = uVar97 & uVar89;
          bVar90 = (byte)uVar97;
          if (bVar90 != 0) {
            uVar89 = vcmpps_avx512vl(auVar119,ZEXT1632(auVar103),2);
            auVar265._8_4_ = 0xff800000;
            auVar265._0_8_ = 0xff800000ff800000;
            auVar265._12_4_ = 0xff800000;
            auVar265._16_4_ = 0xff800000;
            auVar265._20_4_ = 0xff800000;
            auVar265._24_4_ = 0xff800000;
            auVar265._28_4_ = 0xff800000;
            auVar269._8_4_ = 0x7f800000;
            auVar269._0_8_ = 0x7f8000007f800000;
            auVar269._12_4_ = 0x7f800000;
            auVar269._16_4_ = 0x7f800000;
            auVar269._20_4_ = 0x7f800000;
            auVar269._24_4_ = 0x7f800000;
            auVar269._28_4_ = 0x7f800000;
            auVar117 = vblendmps_avx512vl(auVar269,auVar265);
            bVar92 = (byte)uVar89;
            uVar98 = (uint)(bVar92 & 1) * auVar117._0_4_ |
                     (uint)!(bool)(bVar92 & 1) * auVar118._0_4_;
            bVar5 = (bool)((byte)(uVar89 >> 1) & 1);
            uVar163 = (uint)bVar5 * auVar117._4_4_ | (uint)!bVar5 * auVar118._4_4_;
            bVar5 = (bool)((byte)(uVar89 >> 2) & 1);
            uVar164 = (uint)bVar5 * auVar117._8_4_ | (uint)!bVar5 * auVar118._8_4_;
            bVar5 = (bool)((byte)(uVar89 >> 3) & 1);
            uVar165 = (uint)bVar5 * auVar117._12_4_ | (uint)!bVar5 * auVar118._12_4_;
            bVar5 = (bool)((byte)(uVar89 >> 4) & 1);
            uVar166 = (uint)bVar5 * auVar117._16_4_ | (uint)!bVar5 * auVar118._16_4_;
            bVar5 = (bool)((byte)(uVar89 >> 5) & 1);
            uVar167 = (uint)bVar5 * auVar117._20_4_ | (uint)!bVar5 * auVar118._20_4_;
            bVar5 = (bool)((byte)(uVar89 >> 6) & 1);
            uVar168 = (uint)bVar5 * auVar117._24_4_ | (uint)!bVar5 * auVar118._24_4_;
            bVar5 = SUB81(uVar89 >> 7,0);
            uVar169 = (uint)bVar5 * auVar117._28_4_ | (uint)!bVar5 * auVar118._28_4_;
            auVar148._0_4_ = (bVar90 & 1) * uVar98 | !(bool)(bVar90 & 1) * auVar148._0_4_;
            bVar5 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar148._4_4_ = bVar5 * uVar163 | !bVar5 * auVar148._4_4_;
            bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar148._8_4_ = bVar5 * uVar164 | !bVar5 * auVar148._8_4_;
            bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar148._12_4_ = bVar5 * uVar165 | !bVar5 * auVar148._12_4_;
            bVar5 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar148._16_4_ = bVar5 * uVar166 | !bVar5 * auVar148._16_4_;
            bVar5 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar148._20_4_ = bVar5 * uVar167 | !bVar5 * auVar148._20_4_;
            bVar5 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar148._24_4_ = bVar5 * uVar168 | !bVar5 * auVar148._24_4_;
            bVar5 = SUB81(uVar97 >> 7,0);
            auVar148._28_4_ = bVar5 * uVar169 | !bVar5 * auVar148._28_4_;
            auVar117 = vblendmps_avx512vl(auVar265,auVar269);
            bVar5 = (bool)((byte)(uVar89 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar89 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar89 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar89 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar89 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar89 >> 6) & 1);
            bVar11 = SUB81(uVar89 >> 7,0);
            auVar149._0_4_ =
                 (uint)(bVar90 & 1) *
                 ((uint)(bVar92 & 1) * auVar117._0_4_ | !(bool)(bVar92 & 1) * uVar98) |
                 !(bool)(bVar90 & 1) * auVar149._0_4_;
            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar149._4_4_ =
                 (uint)bVar96 * ((uint)bVar5 * auVar117._4_4_ | !bVar5 * uVar163) |
                 !bVar96 * auVar149._4_4_;
            bVar5 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar149._8_4_ =
                 (uint)bVar5 * ((uint)bVar6 * auVar117._8_4_ | !bVar6 * uVar164) |
                 !bVar5 * auVar149._8_4_;
            bVar5 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar149._12_4_ =
                 (uint)bVar5 * ((uint)bVar7 * auVar117._12_4_ | !bVar7 * uVar165) |
                 !bVar5 * auVar149._12_4_;
            bVar5 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar149._16_4_ =
                 (uint)bVar5 * ((uint)bVar8 * auVar117._16_4_ | !bVar8 * uVar166) |
                 !bVar5 * auVar149._16_4_;
            bVar5 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar149._20_4_ =
                 (uint)bVar5 * ((uint)bVar9 * auVar117._20_4_ | !bVar9 * uVar167) |
                 !bVar5 * auVar149._20_4_;
            bVar5 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar149._24_4_ =
                 (uint)bVar5 * ((uint)bVar10 * auVar117._24_4_ | !bVar10 * uVar168) |
                 !bVar5 * auVar149._24_4_;
            bVar5 = SUB81(uVar97 >> 7,0);
            auVar149._28_4_ =
                 (uint)bVar5 * ((uint)bVar11 * auVar117._28_4_ | !bVar11 * uVar169) |
                 !bVar5 * auVar149._28_4_;
            bVar93 = (~bVar90 | bVar92) & bVar93;
          }
        }
        auVar116 = vmulps_avx512vl(local_aa0,auVar116);
        auVar113 = vfmadd231ps_avx512vl(auVar116,auVar155._0_32_,auVar113);
        auVar191._0_32_ = vfmadd231ps_avx512vl(auVar113,auVar115,auVar120);
        _local_500 = _local_920;
        local_4e0 = vminps_avx(local_7a0,auVar148);
        auVar255._8_4_ = 0x7fffffff;
        auVar255._0_8_ = 0x7fffffff7fffffff;
        auVar255._12_4_ = 0x7fffffff;
        auVar255._16_4_ = 0x7fffffff;
        auVar255._20_4_ = 0x7fffffff;
        auVar255._24_4_ = 0x7fffffff;
        auVar255._28_4_ = 0x7fffffff;
        auVar113 = vandps_avx(auVar191._0_32_,auVar255);
        auVar247 = ZEXT3264(auVar113);
        _local_880 = vmaxps_avx(_local_920,auVar149);
        _local_7c0 = _local_880;
        auVar229._8_4_ = 0x3e99999a;
        auVar229._0_8_ = 0x3e99999a3e99999a;
        auVar229._12_4_ = 0x3e99999a;
        auVar229._16_4_ = 0x3e99999a;
        auVar229._20_4_ = 0x3e99999a;
        auVar229._24_4_ = 0x3e99999a;
        auVar229._28_4_ = 0x3e99999a;
        uVar21 = vcmpps_avx512vl(auVar113,auVar229,1);
        uVar23 = vcmpps_avx512vl(_local_920,local_4e0,2);
        bVar90 = (byte)uVar23 & bVar86;
        uVar22 = vcmpps_avx512vl(_local_880,local_7a0,2);
        if ((bVar86 & ((byte)uVar22 | (byte)uVar23)) == 0) {
          auVar237 = ZEXT3264(_DAT_02020f20);
        }
        else {
          auVar113 = vmulps_avx512vl(local_aa0,auVar121);
          auVar113 = vfmadd213ps_avx512vl(auVar110,auVar155._0_32_,auVar113);
          auVar113 = vfmadd213ps_avx512vl(auVar124,auVar115,auVar113);
          auVar113 = vandps_avx(auVar113,auVar255);
          uVar23 = vcmpps_avx512vl(auVar113,auVar229,1);
          bVar92 = (byte)uVar23 | ~bVar93;
          auVar185._8_4_ = 2;
          auVar185._0_8_ = 0x200000002;
          auVar185._12_4_ = 2;
          auVar185._16_4_ = 2;
          auVar185._20_4_ = 2;
          auVar185._24_4_ = 2;
          auVar185._28_4_ = 2;
          auVar37._8_4_ = 3;
          auVar37._0_8_ = 0x300000003;
          auVar37._12_4_ = 3;
          auVar37._16_4_ = 3;
          auVar37._20_4_ = 3;
          auVar37._24_4_ = 3;
          auVar37._28_4_ = 3;
          auVar113 = vpblendmd_avx512vl(auVar185,auVar37);
          local_780._0_4_ = (uint)(bVar92 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar92 & 1) * 2;
          bVar5 = (bool)(bVar92 >> 1 & 1);
          local_780._4_4_ = (uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar92 >> 2 & 1);
          local_780._8_4_ = (uint)bVar5 * auVar113._8_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar92 >> 3 & 1);
          local_780._12_4_ = (uint)bVar5 * auVar113._12_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar92 >> 4 & 1);
          local_780._16_4_ = (uint)bVar5 * auVar113._16_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar92 >> 5 & 1);
          local_780._20_4_ = (uint)bVar5 * auVar113._20_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar92 >> 6 & 1);
          local_780._24_4_ = (uint)bVar5 * auVar113._24_4_ | (uint)!bVar5 * 2;
          local_780._28_4_ = (uint)(bVar92 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar92 >> 7) * 2;
          auVar159._0_32_ = vpbroadcastd_avx512vl();
          auVar159._32_32_ = auVar191._32_32_;
          local_800 = auVar159._0_32_;
          uVar23 = vpcmpd_avx512vl(auVar159._0_32_,local_780,5);
          bVar92 = (byte)uVar23 & bVar90;
          auVar238._8_4_ = 0x7fffffff;
          auVar238._0_8_ = 0x7fffffff7fffffff;
          auVar238._12_4_ = 0x7fffffff;
          auVar247 = ZEXT1664(auVar238);
          if (bVar92 != 0) {
            auVar103 = vminps_avx(local_940._0_16_,local_980._0_16_);
            auVar99 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
            auVar104 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar105 = vminps_avx(auVar103,auVar104);
            auVar103 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar104 = vmaxps_avx(auVar99,auVar103);
            auVar99 = vandps_avx(auVar105,auVar238);
            auVar103 = vandps_avx(auVar104,auVar238);
            auVar99 = vmaxps_avx(auVar99,auVar103);
            auVar103 = vmovshdup_avx(auVar99);
            auVar103 = vmaxss_avx(auVar103,auVar99);
            auVar99 = vshufpd_avx(auVar99,auVar99,1);
            auVar99 = vmaxss_avx(auVar99,auVar103);
            fVar170 = auVar99._0_4_ * 1.9073486e-06;
            local_a20 = vshufps_avx(auVar104,auVar104,0xff);
            local_860 = (float)local_920._0_4_ + (float)local_900._0_4_;
            fStack_85c = (float)local_920._4_4_ + (float)local_900._4_4_;
            fStack_858 = fStack_918 + fStack_8f8;
            fStack_854 = fStack_914 + fStack_8f4;
            fStack_850 = fStack_910 + fStack_8f0;
            fStack_84c = fStack_90c + fStack_8ec;
            fStack_848 = fStack_908 + fStack_8e8;
            fStack_844 = fStack_904 + fStack_8e4;
            do {
              auVar186._8_4_ = 0x7f800000;
              auVar186._0_8_ = 0x7f8000007f800000;
              auVar186._12_4_ = 0x7f800000;
              auVar186._16_4_ = 0x7f800000;
              auVar186._20_4_ = 0x7f800000;
              auVar186._24_4_ = 0x7f800000;
              auVar186._28_4_ = 0x7f800000;
              auVar113 = vblendmps_avx512vl(auVar186,_local_920);
              auVar150._0_4_ =
                   (uint)(bVar92 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar92 & 1) * 0x7f800000;
              bVar5 = (bool)(bVar92 >> 1 & 1);
              auVar150._4_4_ = (uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar92 >> 2 & 1);
              auVar150._8_4_ = (uint)bVar5 * auVar113._8_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar92 >> 3 & 1);
              auVar150._12_4_ = (uint)bVar5 * auVar113._12_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar92 >> 4 & 1);
              auVar150._16_4_ = (uint)bVar5 * auVar113._16_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar92 >> 5 & 1);
              auVar150._20_4_ = (uint)bVar5 * auVar113._20_4_ | (uint)!bVar5 * 0x7f800000;
              auVar150._24_4_ =
                   (uint)(bVar92 >> 6) * auVar113._24_4_ | (uint)!(bool)(bVar92 >> 6) * 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar159._0_32_ = auVar150;
              auVar113 = vshufps_avx(auVar150,auVar150,0xb1);
              auVar113 = vminps_avx(auVar150,auVar113);
              auVar116 = vshufpd_avx(auVar113,auVar113,5);
              auVar113 = vminps_avx(auVar113,auVar116);
              auVar116 = vpermpd_avx2(auVar113,0x4e);
              auVar113 = vminps_avx(auVar113,auVar116);
              uVar23 = vcmpps_avx512vl(auVar150,auVar113,0);
              bVar87 = (byte)uVar23 & bVar92;
              bVar88 = bVar92;
              if (bVar87 != 0) {
                bVar88 = bVar87;
              }
              iVar24 = 0;
              for (uVar98 = (uint)bVar88; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              fVar256 = *(float *)(local_820 + (uint)(iVar24 << 2));
              fVar258 = *(float *)(local_500 + (uint)(iVar24 << 2));
              fVar260 = auVar19._0_4_;
              if ((float)local_a40._0_4_ < 0.0) {
                fVar260 = sqrtf((float)local_a40._0_4_);
              }
              lVar95 = 4;
              do {
                auVar171._4_4_ = fVar258;
                auVar171._0_4_ = fVar258;
                auVar171._8_4_ = fVar258;
                auVar171._12_4_ = fVar258;
                auVar103 = vfmadd132ps_fma(auVar171,ZEXT816(0) << 0x40,local_a30);
                fVar267 = 1.0 - fVar256;
                auVar215._0_4_ = local_980._0_4_ * fVar256;
                auVar215._4_4_ = local_980._4_4_ * fVar256;
                auVar215._8_4_ = local_980._8_4_ * fVar256;
                auVar215._12_4_ = local_980._12_4_ * fVar256;
                local_9c0 = ZEXT416((uint)fVar267);
                auVar234._4_4_ = fVar267;
                auVar234._0_4_ = fVar267;
                auVar234._8_4_ = fVar267;
                auVar234._12_4_ = fVar267;
                auVar99 = vfmadd231ps_fma(auVar215,auVar234,local_940._0_16_);
                auVar239._0_4_ = local_960._0_4_ * fVar256;
                auVar239._4_4_ = local_960._4_4_ * fVar256;
                auVar239._8_4_ = local_960._8_4_ * fVar256;
                auVar239._12_4_ = local_960._12_4_ * fVar256;
                auVar104 = vfmadd231ps_fma(auVar239,auVar234,local_980._0_16_);
                auVar249._0_4_ = fVar256 * (float)local_9a0._0_4_;
                auVar249._4_4_ = fVar256 * (float)local_9a0._4_4_;
                auVar249._8_4_ = fVar256 * fStack_998;
                auVar249._12_4_ = fVar256 * fStack_994;
                auVar105 = vfmadd231ps_fma(auVar249,auVar234,local_960._0_16_);
                auVar253._0_4_ = fVar256 * auVar104._0_4_;
                auVar253._4_4_ = fVar256 * auVar104._4_4_;
                auVar253._8_4_ = fVar256 * auVar104._8_4_;
                auVar253._12_4_ = fVar256 * auVar104._12_4_;
                auVar99 = vfmadd231ps_fma(auVar253,auVar234,auVar99);
                auVar216._0_4_ = fVar256 * auVar105._0_4_;
                auVar216._4_4_ = fVar256 * auVar105._4_4_;
                auVar216._8_4_ = fVar256 * auVar105._8_4_;
                auVar216._12_4_ = fVar256 * auVar105._12_4_;
                auVar104 = vfmadd231ps_fma(auVar216,auVar234,auVar104);
                auVar240._0_4_ = fVar256 * auVar104._0_4_;
                auVar240._4_4_ = fVar256 * auVar104._4_4_;
                auVar240._8_4_ = fVar256 * auVar104._8_4_;
                auVar240._12_4_ = fVar256 * auVar104._12_4_;
                auVar105 = vfmadd231ps_fma(auVar240,auVar99,auVar234);
                auVar99 = vsubps_avx(auVar104,auVar99);
                auVar25._8_4_ = 0x40400000;
                auVar25._0_8_ = 0x4040000040400000;
                auVar25._12_4_ = 0x40400000;
                auVar113 = auVar159._32_32_;
                auVar104 = vmulps_avx512vl(auVar99,auVar25);
                local_8e0._0_16_ = auVar105;
                auVar99 = vsubps_avx(auVar103,auVar105);
                local_a60._0_16_ = auVar99;
                auVar99 = vdpps_avx(auVar99,auVar99,0x7f);
                local_a80._0_16_ = auVar99;
                local_bc0 = ZEXT416((uint)fVar256);
                if (auVar99._0_4_ < 0.0) {
                  auVar247._0_4_ = sqrtf(auVar99._0_4_);
                  auVar247._4_60_ = extraout_var;
                  auVar99 = auVar247._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar99,auVar99);
                }
                local_9d0 = vdpps_avx(auVar104,auVar104,0x7f);
                fVar267 = local_9d0._0_4_;
                auVar217._4_12_ = ZEXT812(0) << 0x20;
                auVar217._0_4_ = fVar267;
                auVar103 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar217);
                fVar192 = auVar103._0_4_;
                local_9e0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar217);
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar105 = vxorps_avx512vl(local_9d0,auVar26);
                auVar103 = vfnmadd213ss_fma(local_9e0,local_9d0,ZEXT416(0x40000000));
                uVar98 = auVar99._0_4_;
                if (fVar267 < auVar105._0_4_) {
                  fVar262 = sqrtf(fVar267);
                  auVar99 = ZEXT416(uVar98);
                }
                else {
                  auVar105 = vsqrtss_avx(local_9d0,local_9d0);
                  fVar262 = auVar105._0_4_;
                }
                fVar267 = fVar192 * 1.5 + fVar267 * -0.5 * fVar192 * fVar192 * fVar192;
                auVar172._0_4_ = auVar104._0_4_ * fVar267;
                auVar172._4_4_ = auVar104._4_4_ * fVar267;
                auVar172._8_4_ = auVar104._8_4_ * fVar267;
                auVar172._12_4_ = auVar104._12_4_ * fVar267;
                auVar105 = vdpps_avx(local_a60._0_16_,auVar172,0x7f);
                fVar263 = auVar99._0_4_;
                fVar192 = auVar105._0_4_;
                auVar173._0_4_ = fVar192 * fVar192;
                auVar173._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                auVar173._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                auVar173._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                auVar100 = vsubps_avx512vl(local_a80._0_16_,auVar173);
                fVar232 = auVar100._0_4_;
                auVar194._4_12_ = ZEXT812(0) << 0x20;
                auVar194._0_4_ = fVar232;
                auVar106 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar194);
                auVar107 = vmulss_avx512f(auVar106,ZEXT416(0x3fc00000));
                auVar108 = vmulss_avx512f(auVar100,ZEXT416(0xbf000000));
                if (fVar232 < 0.0) {
                  local_a00 = fVar267;
                  fStack_9fc = fVar267;
                  fStack_9f8 = fVar267;
                  fStack_9f4 = fVar267;
                  local_9f0 = auVar106;
                  fVar232 = sqrtf(fVar232);
                  auVar108 = ZEXT416(auVar108._0_4_);
                  auVar107 = ZEXT416(auVar107._0_4_);
                  auVar99 = ZEXT416(uVar98);
                  auVar106 = local_9f0;
                  fVar267 = local_a00;
                  fVar257 = fStack_9fc;
                  fVar259 = fStack_9f8;
                  fVar261 = fStack_9f4;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar100,auVar100);
                  fVar232 = auVar100._0_4_;
                  fVar257 = fVar267;
                  fVar259 = fVar267;
                  fVar261 = fVar267;
                }
                auVar156._32_32_ = auVar113;
                auVar156._0_32_ = local_aa0;
                auVar272 = ZEXT3264(local_aa0);
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_bc0,local_9c0);
                fVar193 = auVar100._0_4_ * 6.0;
                fVar20 = fVar256 * 6.0;
                auVar218._0_4_ = fVar20 * (float)local_9a0._0_4_;
                auVar218._4_4_ = fVar20 * (float)local_9a0._4_4_;
                auVar218._8_4_ = fVar20 * fStack_998;
                auVar218._12_4_ = fVar20 * fStack_994;
                auVar195._4_4_ = fVar193;
                auVar195._0_4_ = fVar193;
                auVar195._8_4_ = fVar193;
                auVar195._12_4_ = fVar193;
                auVar100 = vfmadd132ps_fma(auVar195,auVar218,local_960._0_16_);
                auVar248 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9c0,local_bc0);
                fVar193 = auVar248._0_4_ * 6.0;
                auVar219._4_4_ = fVar193;
                auVar219._0_4_ = fVar193;
                auVar219._8_4_ = fVar193;
                auVar219._12_4_ = fVar193;
                auVar100 = vfmadd132ps_fma(auVar219,auVar100,local_980._0_16_);
                fVar193 = local_9c0._0_4_ * 6.0;
                auVar196._4_4_ = fVar193;
                auVar196._0_4_ = fVar193;
                auVar196._8_4_ = fVar193;
                auVar196._12_4_ = fVar193;
                auVar100 = vfmadd132ps_fma(auVar196,auVar100,local_940._0_16_);
                auVar220._0_4_ = auVar100._0_4_ * (float)local_9d0._0_4_;
                auVar220._4_4_ = auVar100._4_4_ * (float)local_9d0._0_4_;
                auVar220._8_4_ = auVar100._8_4_ * (float)local_9d0._0_4_;
                auVar220._12_4_ = auVar100._12_4_ * (float)local_9d0._0_4_;
                auVar100 = vdpps_avx(auVar104,auVar100,0x7f);
                fVar193 = auVar100._0_4_;
                auVar197._0_4_ = auVar104._0_4_ * fVar193;
                auVar197._4_4_ = auVar104._4_4_ * fVar193;
                auVar197._8_4_ = auVar104._8_4_ * fVar193;
                auVar197._12_4_ = auVar104._12_4_ * fVar193;
                auVar100 = vsubps_avx(auVar220,auVar197);
                fVar193 = auVar103._0_4_ * (float)local_9e0._0_4_;
                auVar27._8_4_ = 0x80000000;
                auVar27._0_8_ = 0x8000000080000000;
                auVar27._12_4_ = 0x80000000;
                auVar159._16_48_ = auVar156._16_48_;
                auVar109 = vxorps_avx512vl(auVar104,auVar27);
                auVar241._0_4_ = fVar267 * auVar100._0_4_ * fVar193;
                auVar241._4_4_ = fVar257 * auVar100._4_4_ * fVar193;
                auVar241._8_4_ = fVar259 * auVar100._8_4_ * fVar193;
                auVar241._12_4_ = fVar261 * auVar100._12_4_ * fVar193;
                auVar103 = vdpps_avx(auVar109,auVar172,0x7f);
                auVar248 = vmaxss_avx(ZEXT416((uint)fVar170),
                                      ZEXT416((uint)(fVar258 * fVar260 * 1.9073486e-06)));
                auVar100 = vdpps_avx(local_a60._0_16_,auVar241,0x7f);
                auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar170),auVar248);
                auVar102 = vfmadd213ss_fma(ZEXT416((uint)(fVar263 + 1.0)),
                                           ZEXT416((uint)(fVar170 / fVar262)),auVar99);
                auVar99 = vdpps_avx(local_a30,auVar172,0x7f);
                fVar267 = auVar103._0_4_ + auVar100._0_4_;
                auVar103 = vdpps_avx(local_a60._0_16_,auVar109,0x7f);
                auVar100 = vmulss_avx512f(auVar108,auVar106);
                auVar108 = vmulss_avx512f(auVar106,auVar106);
                auVar106 = vdpps_avx(local_a60._0_16_,local_a30,0x7f);
                auVar159._0_16_ =
                     vaddss_avx512f(auVar107,ZEXT416((uint)(auVar100._0_4_ * auVar108._0_4_)));
                auVar100 = vfnmadd231ss_fma(auVar103,auVar105,ZEXT416((uint)fVar267));
                auVar107 = vfnmadd231ss_fma(auVar106,auVar105,auVar99);
                auVar103 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar232 = fVar232 - auVar103._0_4_;
                auVar103 = vshufps_avx(auVar104,auVar104,0xff);
                auVar106 = vfmsub213ss_fma(auVar100,auVar159._0_16_,auVar103);
                fVar262 = auVar107._0_4_ * auVar159._0_4_;
                auVar100 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar106._0_4_)),
                                           ZEXT416((uint)fVar267),ZEXT416((uint)fVar262));
                fVar263 = auVar100._0_4_;
                fVar256 = fVar256 - (fVar192 * (fVar262 / fVar263) -
                                    fVar232 * (auVar99._0_4_ / fVar263));
                fVar258 = fVar258 - (fVar232 * (fVar267 / fVar263) -
                                    fVar192 * (auVar106._0_4_ / fVar263));
                auVar242._8_4_ = 0x7fffffff;
                auVar242._0_8_ = 0x7fffffff7fffffff;
                auVar242._12_4_ = 0x7fffffff;
                auVar247 = ZEXT1664(auVar242);
                auVar99 = vandps_avx(auVar105,auVar242);
                if (auVar102._0_4_ <= auVar99._0_4_) {
LAB_01d7fd71:
                  bVar5 = false;
                }
                else {
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(auVar102._0_4_ + auVar248._0_4_)),
                                             local_a20,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(ZEXT416((uint)fVar232),auVar242);
                  if (auVar105._0_4_ <= auVar99._0_4_) goto LAB_01d7fd71;
                  fVar258 = fVar258 + (float)local_a10._0_4_;
                  bVar5 = true;
                  if ((((fVar233 <= fVar258) &&
                       (fVar267 = *(float *)(ray + k * 4 + 0x200), fVar258 <= fVar267)) &&
                      (0.0 <= fVar256)) && (fVar256 <= 1.0)) {
                    auVar158._16_48_ = auVar159._16_48_;
                    auVar158._0_16_ = ZEXT816(0) << 0x20;
                    auVar157._4_60_ = auVar158._4_60_;
                    auVar157._0_4_ = local_a80._0_4_;
                    auVar99 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar157._0_16_);
                    fVar192 = auVar99._0_4_;
                    auVar159._0_16_ = vmulss_avx512f(local_a80._0_16_,ZEXT416(0xbf000000));
                    pGVar2 = (context->scene->geometries).items[uVar94].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar192 = fVar192 * 1.5 + auVar159._0_4_ * fVar192 * fVar192 * fVar192;
                      auVar198._0_4_ = local_a60._0_4_ * fVar192;
                      auVar198._4_4_ = local_a60._4_4_ * fVar192;
                      auVar198._8_4_ = local_a60._8_4_ * fVar192;
                      auVar198._12_4_ = local_a60._12_4_ * fVar192;
                      auVar105 = vfmadd213ps_fma(auVar103,auVar198,auVar104);
                      auVar99 = vshufps_avx(auVar198,auVar198,0xc9);
                      auVar103 = vshufps_avx(auVar104,auVar104,0xc9);
                      auVar199._0_4_ = auVar198._0_4_ * auVar103._0_4_;
                      auVar199._4_4_ = auVar198._4_4_ * auVar103._4_4_;
                      auVar199._8_4_ = auVar198._8_4_ * auVar103._8_4_;
                      auVar199._12_4_ = auVar198._12_4_ * auVar103._12_4_;
                      auVar104 = vfmsub231ps_fma(auVar199,auVar104,auVar99);
                      auVar99 = vshufps_avx(auVar104,auVar104,0xc9);
                      auVar103 = vshufps_avx(auVar105,auVar105,0xc9);
                      auVar104 = vshufps_avx(auVar104,auVar104,0xd2);
                      auVar174._0_4_ = auVar105._0_4_ * auVar104._0_4_;
                      auVar174._4_4_ = auVar105._4_4_ * auVar104._4_4_;
                      auVar174._8_4_ = auVar105._8_4_ * auVar104._8_4_;
                      auVar174._12_4_ = auVar105._12_4_ * auVar104._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar174,auVar99,auVar103);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar258;
                        uVar266 = vextractps_avx(auVar99,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar266;
                        uVar266 = vextractps_avx(auVar99,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar266;
                        *(int *)(ray + k * 4 + 0x380) = auVar99._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar256;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(int *)(ray + k * 4 + 0x440) = (int)local_aa8;
                        *(uint *)(ray + k * 4 + 0x480) = uVar94;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar3 = context->user;
                        local_340 = vbroadcastss_avx512f(ZEXT416((uint)fVar256));
                        auVar191 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar191 = vpermps_avx512f(auVar191,ZEXT1664(auVar99));
                        auVar154 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar154,ZEXT1664(auVar99));
                        local_380 = vbroadcastss_avx512f(auVar99);
                        local_400[0] = (RTCHitN)auVar191[0];
                        local_400[1] = (RTCHitN)auVar191[1];
                        local_400[2] = (RTCHitN)auVar191[2];
                        local_400[3] = (RTCHitN)auVar191[3];
                        local_400[4] = (RTCHitN)auVar191[4];
                        local_400[5] = (RTCHitN)auVar191[5];
                        local_400[6] = (RTCHitN)auVar191[6];
                        local_400[7] = (RTCHitN)auVar191[7];
                        local_400[8] = (RTCHitN)auVar191[8];
                        local_400[9] = (RTCHitN)auVar191[9];
                        local_400[10] = (RTCHitN)auVar191[10];
                        local_400[0xb] = (RTCHitN)auVar191[0xb];
                        local_400[0xc] = (RTCHitN)auVar191[0xc];
                        local_400[0xd] = (RTCHitN)auVar191[0xd];
                        local_400[0xe] = (RTCHitN)auVar191[0xe];
                        local_400[0xf] = (RTCHitN)auVar191[0xf];
                        local_400[0x10] = (RTCHitN)auVar191[0x10];
                        local_400[0x11] = (RTCHitN)auVar191[0x11];
                        local_400[0x12] = (RTCHitN)auVar191[0x12];
                        local_400[0x13] = (RTCHitN)auVar191[0x13];
                        local_400[0x14] = (RTCHitN)auVar191[0x14];
                        local_400[0x15] = (RTCHitN)auVar191[0x15];
                        local_400[0x16] = (RTCHitN)auVar191[0x16];
                        local_400[0x17] = (RTCHitN)auVar191[0x17];
                        local_400[0x18] = (RTCHitN)auVar191[0x18];
                        local_400[0x19] = (RTCHitN)auVar191[0x19];
                        local_400[0x1a] = (RTCHitN)auVar191[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar191[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar191[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar191[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar191[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar191[0x1f];
                        local_400[0x20] = (RTCHitN)auVar191[0x20];
                        local_400[0x21] = (RTCHitN)auVar191[0x21];
                        local_400[0x22] = (RTCHitN)auVar191[0x22];
                        local_400[0x23] = (RTCHitN)auVar191[0x23];
                        local_400[0x24] = (RTCHitN)auVar191[0x24];
                        local_400[0x25] = (RTCHitN)auVar191[0x25];
                        local_400[0x26] = (RTCHitN)auVar191[0x26];
                        local_400[0x27] = (RTCHitN)auVar191[0x27];
                        local_400[0x28] = (RTCHitN)auVar191[0x28];
                        local_400[0x29] = (RTCHitN)auVar191[0x29];
                        local_400[0x2a] = (RTCHitN)auVar191[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar191[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar191[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar191[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar191[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar191[0x2f];
                        local_400[0x30] = (RTCHitN)auVar191[0x30];
                        local_400[0x31] = (RTCHitN)auVar191[0x31];
                        local_400[0x32] = (RTCHitN)auVar191[0x32];
                        local_400[0x33] = (RTCHitN)auVar191[0x33];
                        local_400[0x34] = (RTCHitN)auVar191[0x34];
                        local_400[0x35] = (RTCHitN)auVar191[0x35];
                        local_400[0x36] = (RTCHitN)auVar191[0x36];
                        local_400[0x37] = (RTCHitN)auVar191[0x37];
                        local_400[0x38] = (RTCHitN)auVar191[0x38];
                        local_400[0x39] = (RTCHitN)auVar191[0x39];
                        local_400[0x3a] = (RTCHitN)auVar191[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar191[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar191[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar191[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar191[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar191[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar191 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar191);
                        auVar113 = vpcmpeqd_avx2(auVar191._0_32_,auVar191._0_32_);
                        local_ac8[3] = auVar113;
                        local_ac8[2] = auVar113;
                        local_ac8[1] = auVar113;
                        *local_ac8 = auVar113;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar3->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar3->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar258;
                        local_8c0 = local_4c0;
                        local_b10.valid = (int *)local_8c0;
                        local_b10.geometryUserPtr = pGVar2->userPtr;
                        local_b10.context = context->user;
                        local_b10.hit = local_400;
                        local_b10.N = 0x10;
                        local_b10.ray = (RTCRayN *)ray;
                        if (pGVar2->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar2->intersectionFilterN)(&local_b10);
                          auVar272 = ZEXT3264(local_aa0);
                          auVar247 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar159 = vmovdqa64_avx512f(local_8c0);
                        uVar23 = vptestmd_avx512f(auVar159,auVar159);
                        if ((short)uVar23 != 0) {
                          p_Var4 = context->args->filter;
                          if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var4)(&local_b10);
                            auVar272 = ZEXT3264(local_aa0);
                            auVar247 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar159 = vmovdqa64_avx512f(local_8c0);
                          uVar97 = vptestmd_avx512f(auVar159,auVar159);
                          if ((short)uVar97 != 0) {
                            iVar65 = *(int *)(local_b10.hit + 4);
                            iVar66 = *(int *)(local_b10.hit + 8);
                            iVar67 = *(int *)(local_b10.hit + 0xc);
                            iVar68 = *(int *)(local_b10.hit + 0x10);
                            iVar69 = *(int *)(local_b10.hit + 0x14);
                            iVar70 = *(int *)(local_b10.hit + 0x18);
                            iVar71 = *(int *)(local_b10.hit + 0x1c);
                            iVar72 = *(int *)(local_b10.hit + 0x20);
                            iVar73 = *(int *)(local_b10.hit + 0x24);
                            iVar74 = *(int *)(local_b10.hit + 0x28);
                            iVar75 = *(int *)(local_b10.hit + 0x2c);
                            iVar76 = *(int *)(local_b10.hit + 0x30);
                            iVar77 = *(int *)(local_b10.hit + 0x34);
                            iVar78 = *(int *)(local_b10.hit + 0x38);
                            iVar79 = *(int *)(local_b10.hit + 0x3c);
                            bVar88 = (byte)uVar97;
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar97 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar97 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar97 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar97 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar97 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar97 >> 7) & 1);
                            bVar87 = (byte)(uVar97 >> 8);
                            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            bVar18 = SUB81(uVar97 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x300) =
                                 (uint)(bVar88 & 1) * *(int *)local_b10.hit |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_b10.ray + 0x300);
                            *(uint *)(local_b10.ray + 0x304) =
                                 (uint)bVar96 * iVar65 |
                                 (uint)!bVar96 * *(int *)(local_b10.ray + 0x304);
                            *(uint *)(local_b10.ray + 0x308) =
                                 (uint)bVar6 * iVar66 |
                                 (uint)!bVar6 * *(int *)(local_b10.ray + 0x308);
                            *(uint *)(local_b10.ray + 0x30c) =
                                 (uint)bVar7 * iVar67 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x30c);
                            *(uint *)(local_b10.ray + 0x310) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x310);
                            *(uint *)(local_b10.ray + 0x314) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x314);
                            *(uint *)(local_b10.ray + 0x318) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x318);
                            *(uint *)(local_b10.ray + 0x31c) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x31c);
                            *(uint *)(local_b10.ray + 800) =
                                 (uint)(bVar87 & 1) * iVar72 |
                                 (uint)!(bool)(bVar87 & 1) * *(int *)(local_b10.ray + 800);
                            *(uint *)(local_b10.ray + 0x324) =
                                 (uint)bVar12 * iVar73 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x324);
                            *(uint *)(local_b10.ray + 0x328) =
                                 (uint)bVar13 * iVar74 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x328);
                            *(uint *)(local_b10.ray + 0x32c) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x32c);
                            *(uint *)(local_b10.ray + 0x330) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x330);
                            *(uint *)(local_b10.ray + 0x334) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x334);
                            *(uint *)(local_b10.ray + 0x338) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x338);
                            *(uint *)(local_b10.ray + 0x33c) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x33c);
                            iVar65 = *(int *)(local_b10.hit + 0x44);
                            iVar66 = *(int *)(local_b10.hit + 0x48);
                            iVar67 = *(int *)(local_b10.hit + 0x4c);
                            iVar68 = *(int *)(local_b10.hit + 0x50);
                            iVar69 = *(int *)(local_b10.hit + 0x54);
                            iVar70 = *(int *)(local_b10.hit + 0x58);
                            iVar71 = *(int *)(local_b10.hit + 0x5c);
                            iVar72 = *(int *)(local_b10.hit + 0x60);
                            iVar73 = *(int *)(local_b10.hit + 100);
                            iVar74 = *(int *)(local_b10.hit + 0x68);
                            iVar75 = *(int *)(local_b10.hit + 0x6c);
                            iVar76 = *(int *)(local_b10.hit + 0x70);
                            iVar77 = *(int *)(local_b10.hit + 0x74);
                            iVar78 = *(int *)(local_b10.hit + 0x78);
                            iVar79 = *(int *)(local_b10.hit + 0x7c);
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar97 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar97 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar97 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar97 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar97 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar97 >> 7) & 1);
                            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            bVar18 = SUB81(uVar97 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x340) =
                                 (uint)(bVar88 & 1) * *(int *)(local_b10.hit + 0x40) |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_b10.ray + 0x340);
                            *(uint *)(local_b10.ray + 0x344) =
                                 (uint)bVar96 * iVar65 |
                                 (uint)!bVar96 * *(int *)(local_b10.ray + 0x344);
                            *(uint *)(local_b10.ray + 0x348) =
                                 (uint)bVar6 * iVar66 |
                                 (uint)!bVar6 * *(int *)(local_b10.ray + 0x348);
                            *(uint *)(local_b10.ray + 0x34c) =
                                 (uint)bVar7 * iVar67 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x34c);
                            *(uint *)(local_b10.ray + 0x350) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x350);
                            *(uint *)(local_b10.ray + 0x354) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x354);
                            *(uint *)(local_b10.ray + 0x358) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x358);
                            *(uint *)(local_b10.ray + 0x35c) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x35c);
                            *(uint *)(local_b10.ray + 0x360) =
                                 (uint)(bVar87 & 1) * iVar72 |
                                 (uint)!(bool)(bVar87 & 1) * *(int *)(local_b10.ray + 0x360);
                            *(uint *)(local_b10.ray + 0x364) =
                                 (uint)bVar12 * iVar73 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x364);
                            *(uint *)(local_b10.ray + 0x368) =
                                 (uint)bVar13 * iVar74 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x368);
                            *(uint *)(local_b10.ray + 0x36c) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x36c);
                            *(uint *)(local_b10.ray + 0x370) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x370);
                            *(uint *)(local_b10.ray + 0x374) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x374);
                            *(uint *)(local_b10.ray + 0x378) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x378);
                            *(uint *)(local_b10.ray + 0x37c) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x37c);
                            iVar65 = *(int *)(local_b10.hit + 0x84);
                            iVar66 = *(int *)(local_b10.hit + 0x88);
                            iVar67 = *(int *)(local_b10.hit + 0x8c);
                            iVar68 = *(int *)(local_b10.hit + 0x90);
                            iVar69 = *(int *)(local_b10.hit + 0x94);
                            iVar70 = *(int *)(local_b10.hit + 0x98);
                            iVar71 = *(int *)(local_b10.hit + 0x9c);
                            iVar72 = *(int *)(local_b10.hit + 0xa0);
                            iVar73 = *(int *)(local_b10.hit + 0xa4);
                            iVar74 = *(int *)(local_b10.hit + 0xa8);
                            iVar75 = *(int *)(local_b10.hit + 0xac);
                            iVar76 = *(int *)(local_b10.hit + 0xb0);
                            iVar77 = *(int *)(local_b10.hit + 0xb4);
                            iVar78 = *(int *)(local_b10.hit + 0xb8);
                            iVar79 = *(int *)(local_b10.hit + 0xbc);
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar97 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar97 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar97 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar97 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar97 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar97 >> 7) & 1);
                            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            bVar18 = SUB81(uVar97 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x380) =
                                 (uint)(bVar88 & 1) * *(int *)(local_b10.hit + 0x80) |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_b10.ray + 0x380);
                            *(uint *)(local_b10.ray + 900) =
                                 (uint)bVar96 * iVar65 |
                                 (uint)!bVar96 * *(int *)(local_b10.ray + 900);
                            *(uint *)(local_b10.ray + 0x388) =
                                 (uint)bVar6 * iVar66 |
                                 (uint)!bVar6 * *(int *)(local_b10.ray + 0x388);
                            *(uint *)(local_b10.ray + 0x38c) =
                                 (uint)bVar7 * iVar67 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x38c);
                            *(uint *)(local_b10.ray + 0x390) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x390);
                            *(uint *)(local_b10.ray + 0x394) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x394);
                            *(uint *)(local_b10.ray + 0x398) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x398);
                            *(uint *)(local_b10.ray + 0x39c) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x39c);
                            *(uint *)(local_b10.ray + 0x3a0) =
                                 (uint)(bVar87 & 1) * iVar72 |
                                 (uint)!(bool)(bVar87 & 1) * *(int *)(local_b10.ray + 0x3a0);
                            *(uint *)(local_b10.ray + 0x3a4) =
                                 (uint)bVar12 * iVar73 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x3a4);
                            *(uint *)(local_b10.ray + 0x3a8) =
                                 (uint)bVar13 * iVar74 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x3a8);
                            *(uint *)(local_b10.ray + 0x3ac) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3ac);
                            *(uint *)(local_b10.ray + 0x3b0) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3b0);
                            *(uint *)(local_b10.ray + 0x3b4) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3b4);
                            *(uint *)(local_b10.ray + 0x3b8) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3b8);
                            *(uint *)(local_b10.ray + 0x3bc) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3bc);
                            iVar65 = *(int *)(local_b10.hit + 0xc4);
                            iVar66 = *(int *)(local_b10.hit + 200);
                            iVar67 = *(int *)(local_b10.hit + 0xcc);
                            iVar68 = *(int *)(local_b10.hit + 0xd0);
                            iVar69 = *(int *)(local_b10.hit + 0xd4);
                            iVar70 = *(int *)(local_b10.hit + 0xd8);
                            iVar71 = *(int *)(local_b10.hit + 0xdc);
                            iVar72 = *(int *)(local_b10.hit + 0xe0);
                            iVar73 = *(int *)(local_b10.hit + 0xe4);
                            iVar74 = *(int *)(local_b10.hit + 0xe8);
                            iVar75 = *(int *)(local_b10.hit + 0xec);
                            iVar76 = *(int *)(local_b10.hit + 0xf0);
                            iVar77 = *(int *)(local_b10.hit + 0xf4);
                            iVar78 = *(int *)(local_b10.hit + 0xf8);
                            iVar79 = *(int *)(local_b10.hit + 0xfc);
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar97 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar97 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar97 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar97 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar97 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar97 >> 7) & 1);
                            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            bVar18 = SUB81(uVar97 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x3c0) =
                                 (uint)(bVar88 & 1) * *(int *)(local_b10.hit + 0xc0) |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_b10.ray + 0x3c0);
                            *(uint *)(local_b10.ray + 0x3c4) =
                                 (uint)bVar96 * iVar65 |
                                 (uint)!bVar96 * *(int *)(local_b10.ray + 0x3c4);
                            *(uint *)(local_b10.ray + 0x3c8) =
                                 (uint)bVar6 * iVar66 |
                                 (uint)!bVar6 * *(int *)(local_b10.ray + 0x3c8);
                            *(uint *)(local_b10.ray + 0x3cc) =
                                 (uint)bVar7 * iVar67 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x3cc);
                            *(uint *)(local_b10.ray + 0x3d0) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x3d0);
                            *(uint *)(local_b10.ray + 0x3d4) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x3d4);
                            *(uint *)(local_b10.ray + 0x3d8) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x3d8);
                            *(uint *)(local_b10.ray + 0x3dc) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x3dc);
                            *(uint *)(local_b10.ray + 0x3e0) =
                                 (uint)(bVar87 & 1) * iVar72 |
                                 (uint)!(bool)(bVar87 & 1) * *(int *)(local_b10.ray + 0x3e0);
                            *(uint *)(local_b10.ray + 0x3e4) =
                                 (uint)bVar12 * iVar73 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x3e4);
                            *(uint *)(local_b10.ray + 1000) =
                                 (uint)bVar13 * iVar74 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 1000);
                            *(uint *)(local_b10.ray + 0x3ec) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3ec);
                            *(uint *)(local_b10.ray + 0x3f0) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3f0);
                            *(uint *)(local_b10.ray + 0x3f4) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3f4);
                            *(uint *)(local_b10.ray + 0x3f8) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3f8);
                            *(uint *)(local_b10.ray + 0x3fc) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3fc);
                            iVar65 = *(int *)(local_b10.hit + 0x104);
                            iVar66 = *(int *)(local_b10.hit + 0x108);
                            iVar67 = *(int *)(local_b10.hit + 0x10c);
                            iVar68 = *(int *)(local_b10.hit + 0x110);
                            iVar69 = *(int *)(local_b10.hit + 0x114);
                            iVar70 = *(int *)(local_b10.hit + 0x118);
                            iVar71 = *(int *)(local_b10.hit + 0x11c);
                            iVar72 = *(int *)(local_b10.hit + 0x120);
                            iVar73 = *(int *)(local_b10.hit + 0x124);
                            iVar74 = *(int *)(local_b10.hit + 0x128);
                            iVar75 = *(int *)(local_b10.hit + 300);
                            iVar76 = *(int *)(local_b10.hit + 0x130);
                            iVar77 = *(int *)(local_b10.hit + 0x134);
                            iVar78 = *(int *)(local_b10.hit + 0x138);
                            iVar79 = *(int *)(local_b10.hit + 0x13c);
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar97 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar97 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar97 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar97 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar97 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar97 >> 7) & 1);
                            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            bVar18 = SUB81(uVar97 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x400) =
                                 (uint)(bVar88 & 1) * *(int *)(local_b10.hit + 0x100) |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_b10.ray + 0x400);
                            *(uint *)(local_b10.ray + 0x404) =
                                 (uint)bVar96 * iVar65 |
                                 (uint)!bVar96 * *(int *)(local_b10.ray + 0x404);
                            *(uint *)(local_b10.ray + 0x408) =
                                 (uint)bVar6 * iVar66 |
                                 (uint)!bVar6 * *(int *)(local_b10.ray + 0x408);
                            *(uint *)(local_b10.ray + 0x40c) =
                                 (uint)bVar7 * iVar67 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x40c);
                            *(uint *)(local_b10.ray + 0x410) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x410);
                            *(uint *)(local_b10.ray + 0x414) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x414);
                            *(uint *)(local_b10.ray + 0x418) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x418);
                            *(uint *)(local_b10.ray + 0x41c) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x41c);
                            *(uint *)(local_b10.ray + 0x420) =
                                 (uint)(bVar87 & 1) * iVar72 |
                                 (uint)!(bool)(bVar87 & 1) * *(int *)(local_b10.ray + 0x420);
                            *(uint *)(local_b10.ray + 0x424) =
                                 (uint)bVar12 * iVar73 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x424);
                            *(uint *)(local_b10.ray + 0x428) =
                                 (uint)bVar13 * iVar74 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x428);
                            *(uint *)(local_b10.ray + 0x42c) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x42c);
                            *(uint *)(local_b10.ray + 0x430) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x430);
                            *(uint *)(local_b10.ray + 0x434) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x434);
                            *(uint *)(local_b10.ray + 0x438) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x438);
                            *(uint *)(local_b10.ray + 0x43c) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x43c);
                            auVar191 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x140));
                            auVar191 = vmovdqu32_avx512f(auVar191);
                            *(undefined1 (*) [64])(local_b10.ray + 0x440) = auVar191;
                            auVar191 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x180));
                            auVar191 = vmovdqu32_avx512f(auVar191);
                            *(undefined1 (*) [64])(local_b10.ray + 0x480) = auVar191;
                            auVar154 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x1c0));
                            auVar191 = vmovdqa32_avx512f(auVar154);
                            *(undefined1 (*) [64])(local_b10.ray + 0x4c0) = auVar191;
                            auVar191 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x200));
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            auVar62._4_56_ = auVar191._8_56_;
                            auVar62._0_4_ =
                                 (uint)bVar96 * auVar191._4_4_ | (uint)!bVar96 * auVar154._4_4_;
                            auVar159._0_8_ = auVar62._0_8_ << 0x20;
                            bVar96 = (bool)((byte)(uVar97 >> 2) & 1);
                            auVar159._8_4_ =
                                 (uint)bVar96 * auVar191._8_4_ | (uint)!bVar96 * auVar154._8_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 3) & 1);
                            auVar159._12_4_ =
                                 (uint)bVar96 * auVar191._12_4_ | (uint)!bVar96 * auVar154._12_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 4) & 1);
                            auVar159._16_4_ =
                                 (uint)bVar96 * auVar191._16_4_ | (uint)!bVar96 * auVar154._16_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 5) & 1);
                            auVar159._20_4_ =
                                 (uint)bVar96 * auVar191._20_4_ | (uint)!bVar96 * auVar154._20_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 6) & 1);
                            auVar159._24_4_ =
                                 (uint)bVar96 * auVar191._24_4_ | (uint)!bVar96 * auVar154._24_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 7) & 1);
                            auVar159._28_4_ =
                                 (uint)bVar96 * auVar191._28_4_ | (uint)!bVar96 * auVar154._28_4_;
                            auVar159._32_4_ =
                                 (uint)(bVar87 & 1) * auVar191._32_4_ |
                                 (uint)!(bool)(bVar87 & 1) * auVar154._32_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 9) & 1);
                            auVar159._36_4_ =
                                 (uint)bVar96 * auVar191._36_4_ | (uint)!bVar96 * auVar154._36_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 10) & 1);
                            auVar159._40_4_ =
                                 (uint)bVar96 * auVar191._40_4_ | (uint)!bVar96 * auVar154._40_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            auVar159._44_4_ =
                                 (uint)bVar96 * auVar191._44_4_ | (uint)!bVar96 * auVar154._44_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            auVar159._48_4_ =
                                 (uint)bVar96 * auVar191._48_4_ | (uint)!bVar96 * auVar154._48_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            auVar159._52_4_ =
                                 (uint)bVar96 * auVar191._52_4_ | (uint)!bVar96 * auVar154._52_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            auVar159._56_4_ =
                                 (uint)bVar96 * auVar191._56_4_ | (uint)!bVar96 * auVar154._56_4_;
                            bVar96 = SUB81(uVar97 >> 0xf,0);
                            auVar159._60_4_ =
                                 (uint)bVar96 * auVar191._60_4_ | (uint)!bVar96 * auVar154._60_4_;
                            auVar191 = vmovdqa32_avx512f(auVar191);
                            *(undefined1 (*) [64])(local_b10.ray + 0x500) = auVar191;
                            goto LAB_01d7fd74;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar267;
                      }
                    }
                  }
                }
LAB_01d7fd74:
                auVar191._32_32_ = auVar159._32_32_;
                bVar96 = lVar95 != 0;
                lVar95 = lVar95 + -1;
              } while ((!bVar5) && (bVar96));
              auVar80._4_4_ = fStack_85c;
              auVar80._0_4_ = local_860;
              auVar80._8_4_ = fStack_858;
              auVar80._12_4_ = fStack_854;
              auVar80._16_4_ = fStack_850;
              auVar80._20_4_ = fStack_84c;
              auVar80._24_4_ = fStack_848;
              auVar80._28_4_ = fStack_844;
              uVar266 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar38._4_4_ = uVar266;
              auVar38._0_4_ = uVar266;
              auVar38._8_4_ = uVar266;
              auVar38._12_4_ = uVar266;
              auVar38._16_4_ = uVar266;
              auVar38._20_4_ = uVar266;
              auVar38._24_4_ = uVar266;
              auVar38._28_4_ = uVar266;
              uVar23 = vcmpps_avx512vl(auVar80,auVar38,2);
              bVar92 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar92 & (byte)uVar23;
            } while (bVar92 != 0);
          }
          auVar187._0_4_ = (float)local_880._0_4_ + (float)local_900._0_4_;
          auVar187._4_4_ = (float)local_880._4_4_ + (float)local_900._4_4_;
          auVar187._8_4_ = fStack_878 + fStack_8f8;
          auVar187._12_4_ = fStack_874 + fStack_8f4;
          auVar187._16_4_ = fStack_870 + fStack_8f0;
          auVar187._20_4_ = fStack_86c + fStack_8ec;
          auVar187._24_4_ = fStack_868 + fStack_8e8;
          auVar187._28_4_ = fStack_864 + fStack_8e4;
          uVar266 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar39._4_4_ = uVar266;
          auVar39._0_4_ = uVar266;
          auVar39._8_4_ = uVar266;
          auVar39._12_4_ = uVar266;
          auVar39._16_4_ = uVar266;
          auVar39._20_4_ = uVar266;
          auVar39._24_4_ = uVar266;
          auVar39._28_4_ = uVar266;
          uVar23 = vcmpps_avx512vl(auVar187,auVar39,2);
          bVar93 = (byte)uVar21 | ~bVar93;
          bVar86 = (byte)uVar22 & bVar86 & (byte)uVar23;
          auVar188._8_4_ = 2;
          auVar188._0_8_ = 0x200000002;
          auVar188._12_4_ = 2;
          auVar188._16_4_ = 2;
          auVar188._20_4_ = 2;
          auVar188._24_4_ = 2;
          auVar188._28_4_ = 2;
          auVar40._8_4_ = 3;
          auVar40._0_8_ = 0x300000003;
          auVar40._12_4_ = 3;
          auVar40._16_4_ = 3;
          auVar40._20_4_ = 3;
          auVar40._24_4_ = 3;
          auVar40._28_4_ = 3;
          auVar113 = vpblendmd_avx512vl(auVar188,auVar40);
          local_880._0_4_ = (uint)(bVar93 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar93 & 1) * 2;
          bVar5 = (bool)(bVar93 >> 1 & 1);
          local_880._4_4_ = (uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * 2;
          bVar5 = (bool)(bVar93 >> 2 & 1);
          fStack_878 = (float)((uint)bVar5 * auVar113._8_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar93 >> 3 & 1);
          fStack_874 = (float)((uint)bVar5 * auVar113._12_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar93 >> 4 & 1);
          fStack_870 = (float)((uint)bVar5 * auVar113._16_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar93 >> 5 & 1);
          fStack_86c = (float)((uint)bVar5 * auVar113._20_4_ | (uint)!bVar5 * 2);
          bVar5 = (bool)(bVar93 >> 6 & 1);
          fStack_868 = (float)((uint)bVar5 * auVar113._24_4_ | (uint)!bVar5 * 2);
          fStack_864 = (float)((uint)(bVar93 >> 7) * auVar113._28_4_ |
                              (uint)!(bool)(bVar93 >> 7) * 2);
          auVar191._0_32_ = _local_880;
          uVar21 = vpcmpd_avx512vl(_local_880,local_800,2);
          bVar93 = (byte)uVar21 & bVar86;
          if (bVar93 != 0) {
            auVar103 = vminps_avx(local_940._0_16_,local_980._0_16_);
            auVar99 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
            auVar104 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar105 = vminps_avx(auVar103,auVar104);
            auVar103 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar104 = vmaxps_avx(auVar99,auVar103);
            auVar99 = vandps_avx(auVar105,auVar247._0_16_);
            auVar103 = vandps_avx(auVar104,auVar247._0_16_);
            auVar99 = vmaxps_avx(auVar99,auVar103);
            auVar103 = vmovshdup_avx(auVar99);
            auVar103 = vmaxss_avx(auVar103,auVar99);
            auVar99 = vshufpd_avx(auVar99,auVar99,1);
            auVar99 = vmaxss_avx(auVar99,auVar103);
            fVar170 = auVar99._0_4_ * 1.9073486e-06;
            local_a20 = vshufps_avx(auVar104,auVar104,0xff);
            _local_920 = _local_7c0;
            local_860 = (float)local_7c0._0_4_ + (float)local_900._0_4_;
            fStack_85c = (float)local_7c0._4_4_ + (float)local_900._4_4_;
            fStack_858 = fStack_7b8 + fStack_8f8;
            fStack_854 = fStack_7b4 + fStack_8f4;
            fStack_850 = fStack_7b0 + fStack_8f0;
            fStack_84c = fStack_7ac + fStack_8ec;
            fStack_848 = fStack_7a8 + fStack_8e8;
            fStack_844 = fStack_7a4 + fStack_8e4;
            do {
              auVar189._8_4_ = 0x7f800000;
              auVar189._0_8_ = 0x7f8000007f800000;
              auVar189._12_4_ = 0x7f800000;
              auVar189._16_4_ = 0x7f800000;
              auVar189._20_4_ = 0x7f800000;
              auVar189._24_4_ = 0x7f800000;
              auVar189._28_4_ = 0x7f800000;
              auVar113 = vblendmps_avx512vl(auVar189,_local_920);
              auVar151._0_4_ =
                   (uint)(bVar93 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar93 & 1) * 0x7f800000;
              bVar5 = (bool)(bVar93 >> 1 & 1);
              auVar151._4_4_ = (uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar93 >> 2 & 1);
              auVar151._8_4_ = (uint)bVar5 * auVar113._8_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar93 >> 3 & 1);
              auVar151._12_4_ = (uint)bVar5 * auVar113._12_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar93 >> 4 & 1);
              auVar151._16_4_ = (uint)bVar5 * auVar113._16_4_ | (uint)!bVar5 * 0x7f800000;
              bVar5 = (bool)(bVar93 >> 5 & 1);
              auVar151._20_4_ = (uint)bVar5 * auVar113._20_4_ | (uint)!bVar5 * 0x7f800000;
              auVar151._24_4_ =
                   (uint)(bVar93 >> 6) * auVar113._24_4_ | (uint)!(bool)(bVar93 >> 6) * 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar191._0_32_ = auVar151;
              auVar113 = vshufps_avx(auVar151,auVar151,0xb1);
              auVar113 = vminps_avx(auVar151,auVar113);
              auVar116 = vshufpd_avx(auVar113,auVar113,5);
              auVar113 = vminps_avx(auVar113,auVar116);
              auVar116 = vpermpd_avx2(auVar113,0x4e);
              auVar113 = vminps_avx(auVar113,auVar116);
              uVar21 = vcmpps_avx512vl(auVar151,auVar113,0);
              bVar88 = (byte)uVar21 & bVar93;
              bVar92 = bVar93;
              if (bVar88 != 0) {
                bVar92 = bVar88;
              }
              iVar24 = 0;
              for (uVar98 = (uint)bVar92; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              fVar256 = *(float *)(local_840 + (uint)(iVar24 << 2));
              fVar258 = *(float *)(local_7a0 + (uint)(iVar24 << 2));
              fVar260 = auVar101._0_4_;
              if ((float)local_a40._0_4_ < 0.0) {
                fVar260 = sqrtf((float)local_a40._0_4_);
              }
              lVar95 = 4;
              do {
                auVar175._4_4_ = fVar258;
                auVar175._0_4_ = fVar258;
                auVar175._8_4_ = fVar258;
                auVar175._12_4_ = fVar258;
                auVar103 = vfmadd132ps_fma(auVar175,ZEXT816(0) << 0x40,local_a30);
                fVar267 = 1.0 - fVar256;
                auVar221._0_4_ = local_980._0_4_ * fVar256;
                auVar221._4_4_ = local_980._4_4_ * fVar256;
                auVar221._8_4_ = local_980._8_4_ * fVar256;
                auVar221._12_4_ = local_980._12_4_ * fVar256;
                local_9c0 = ZEXT416((uint)fVar267);
                auVar235._4_4_ = fVar267;
                auVar235._0_4_ = fVar267;
                auVar235._8_4_ = fVar267;
                auVar235._12_4_ = fVar267;
                auVar99 = vfmadd231ps_fma(auVar221,auVar235,local_940._0_16_);
                auVar243._0_4_ = local_960._0_4_ * fVar256;
                auVar243._4_4_ = local_960._4_4_ * fVar256;
                auVar243._8_4_ = local_960._8_4_ * fVar256;
                auVar243._12_4_ = local_960._12_4_ * fVar256;
                auVar104 = vfmadd231ps_fma(auVar243,auVar235,local_980._0_16_);
                auVar250._0_4_ = fVar256 * (float)local_9a0._0_4_;
                auVar250._4_4_ = fVar256 * (float)local_9a0._4_4_;
                auVar250._8_4_ = fVar256 * fStack_998;
                auVar250._12_4_ = fVar256 * fStack_994;
                auVar105 = vfmadd231ps_fma(auVar250,auVar235,local_960._0_16_);
                auVar254._0_4_ = fVar256 * auVar104._0_4_;
                auVar254._4_4_ = fVar256 * auVar104._4_4_;
                auVar254._8_4_ = fVar256 * auVar104._8_4_;
                auVar254._12_4_ = fVar256 * auVar104._12_4_;
                auVar99 = vfmadd231ps_fma(auVar254,auVar235,auVar99);
                auVar222._0_4_ = fVar256 * auVar105._0_4_;
                auVar222._4_4_ = fVar256 * auVar105._4_4_;
                auVar222._8_4_ = fVar256 * auVar105._8_4_;
                auVar222._12_4_ = fVar256 * auVar105._12_4_;
                auVar104 = vfmadd231ps_fma(auVar222,auVar235,auVar104);
                auVar244._0_4_ = fVar256 * auVar104._0_4_;
                auVar244._4_4_ = fVar256 * auVar104._4_4_;
                auVar244._8_4_ = fVar256 * auVar104._8_4_;
                auVar244._12_4_ = fVar256 * auVar104._12_4_;
                auVar105 = vfmadd231ps_fma(auVar244,auVar99,auVar235);
                auVar99 = vsubps_avx(auVar104,auVar99);
                auVar28._8_4_ = 0x40400000;
                auVar28._0_8_ = 0x4040000040400000;
                auVar28._12_4_ = 0x40400000;
                auVar113 = auVar191._32_32_;
                auVar104 = vmulps_avx512vl(auVar99,auVar28);
                local_8e0._0_16_ = auVar105;
                auVar99 = vsubps_avx(auVar103,auVar105);
                local_a60._0_16_ = auVar99;
                auVar99 = vdpps_avx(auVar99,auVar99,0x7f);
                local_a80._0_16_ = auVar99;
                local_bc0 = ZEXT416((uint)fVar256);
                if (auVar99._0_4_ < 0.0) {
                  auVar272._0_4_ = sqrtf(auVar99._0_4_);
                  auVar272._4_60_ = extraout_var_00;
                  auVar99 = auVar272._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar99,auVar99);
                }
                local_9d0 = vdpps_avx(auVar104,auVar104,0x7f);
                fVar267 = local_9d0._0_4_;
                auVar223._4_12_ = ZEXT812(0) << 0x20;
                auVar223._0_4_ = fVar267;
                auVar103 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar223);
                fVar192 = auVar103._0_4_;
                local_9e0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar223);
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar105 = vxorps_avx512vl(local_9d0,auVar29);
                auVar103 = vfnmadd213ss_fma(local_9e0,local_9d0,ZEXT416(0x40000000));
                uVar98 = auVar99._0_4_;
                if (fVar267 < auVar105._0_4_) {
                  fVar262 = sqrtf(fVar267);
                  auVar99 = ZEXT416(uVar98);
                }
                else {
                  auVar105 = vsqrtss_avx(local_9d0,local_9d0);
                  fVar262 = auVar105._0_4_;
                }
                fVar267 = fVar192 * 1.5 + fVar267 * -0.5 * fVar192 * fVar192 * fVar192;
                auVar176._0_4_ = auVar104._0_4_ * fVar267;
                auVar176._4_4_ = auVar104._4_4_ * fVar267;
                auVar176._8_4_ = auVar104._8_4_ * fVar267;
                auVar176._12_4_ = auVar104._12_4_ * fVar267;
                auVar105 = vdpps_avx(local_a60._0_16_,auVar176,0x7f);
                fVar263 = auVar99._0_4_;
                fVar192 = auVar105._0_4_;
                auVar177._0_4_ = fVar192 * fVar192;
                auVar177._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                auVar177._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                auVar177._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                auVar100 = vsubps_avx512vl(local_a80._0_16_,auVar177);
                fVar232 = auVar100._0_4_;
                auVar200._4_12_ = ZEXT812(0) << 0x20;
                auVar200._0_4_ = fVar232;
                auVar106 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar200);
                auVar107 = vmulss_avx512f(auVar106,ZEXT416(0x3fc00000));
                auVar108 = vmulss_avx512f(auVar100,ZEXT416(0xbf000000));
                if (fVar232 < 0.0) {
                  local_a00 = fVar267;
                  fStack_9fc = fVar267;
                  fStack_9f8 = fVar267;
                  fStack_9f4 = fVar267;
                  local_9f0 = auVar106;
                  fVar232 = sqrtf(fVar232);
                  auVar108 = ZEXT416(auVar108._0_4_);
                  auVar107 = ZEXT416(auVar107._0_4_);
                  auVar99 = ZEXT416(uVar98);
                  auVar106 = local_9f0;
                  fVar267 = local_a00;
                  fVar257 = fStack_9fc;
                  fVar259 = fStack_9f8;
                  fVar261 = fStack_9f4;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar100,auVar100);
                  fVar232 = auVar100._0_4_;
                  fVar257 = fVar267;
                  fVar259 = fVar267;
                  fVar261 = fVar267;
                }
                auVar160._32_32_ = auVar113;
                auVar160._0_32_ = local_aa0;
                auVar272 = ZEXT3264(local_aa0);
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_bc0,local_9c0);
                fVar193 = auVar100._0_4_ * 6.0;
                fVar20 = fVar256 * 6.0;
                auVar224._0_4_ = fVar20 * (float)local_9a0._0_4_;
                auVar224._4_4_ = fVar20 * (float)local_9a0._4_4_;
                auVar224._8_4_ = fVar20 * fStack_998;
                auVar224._12_4_ = fVar20 * fStack_994;
                auVar201._4_4_ = fVar193;
                auVar201._0_4_ = fVar193;
                auVar201._8_4_ = fVar193;
                auVar201._12_4_ = fVar193;
                auVar100 = vfmadd132ps_fma(auVar201,auVar224,local_960._0_16_);
                auVar248 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9c0,local_bc0);
                fVar193 = auVar248._0_4_ * 6.0;
                auVar225._4_4_ = fVar193;
                auVar225._0_4_ = fVar193;
                auVar225._8_4_ = fVar193;
                auVar225._12_4_ = fVar193;
                auVar100 = vfmadd132ps_fma(auVar225,auVar100,local_980._0_16_);
                fVar193 = local_9c0._0_4_ * 6.0;
                auVar202._4_4_ = fVar193;
                auVar202._0_4_ = fVar193;
                auVar202._8_4_ = fVar193;
                auVar202._12_4_ = fVar193;
                auVar100 = vfmadd132ps_fma(auVar202,auVar100,local_940._0_16_);
                auVar226._0_4_ = auVar100._0_4_ * (float)local_9d0._0_4_;
                auVar226._4_4_ = auVar100._4_4_ * (float)local_9d0._0_4_;
                auVar226._8_4_ = auVar100._8_4_ * (float)local_9d0._0_4_;
                auVar226._12_4_ = auVar100._12_4_ * (float)local_9d0._0_4_;
                auVar100 = vdpps_avx(auVar104,auVar100,0x7f);
                fVar193 = auVar100._0_4_;
                auVar203._0_4_ = auVar104._0_4_ * fVar193;
                auVar203._4_4_ = auVar104._4_4_ * fVar193;
                auVar203._8_4_ = auVar104._8_4_ * fVar193;
                auVar203._12_4_ = auVar104._12_4_ * fVar193;
                auVar100 = vsubps_avx(auVar226,auVar203);
                fVar193 = auVar103._0_4_ * (float)local_9e0._0_4_;
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar191._16_48_ = auVar160._16_48_;
                auVar109 = vxorps_avx512vl(auVar104,auVar30);
                auVar245._0_4_ = fVar267 * auVar100._0_4_ * fVar193;
                auVar245._4_4_ = fVar257 * auVar100._4_4_ * fVar193;
                auVar245._8_4_ = fVar259 * auVar100._8_4_ * fVar193;
                auVar245._12_4_ = fVar261 * auVar100._12_4_ * fVar193;
                auVar103 = vdpps_avx(auVar109,auVar176,0x7f);
                auVar248 = vmaxss_avx(ZEXT416((uint)fVar170),
                                      ZEXT416((uint)(fVar258 * fVar260 * 1.9073486e-06)));
                auVar100 = vdpps_avx(local_a60._0_16_,auVar245,0x7f);
                auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar170),auVar248);
                auVar102 = vfmadd213ss_fma(ZEXT416((uint)(fVar263 + 1.0)),
                                           ZEXT416((uint)(fVar170 / fVar262)),auVar99);
                auVar99 = vdpps_avx(local_a30,auVar176,0x7f);
                fVar267 = auVar103._0_4_ + auVar100._0_4_;
                auVar103 = vdpps_avx(local_a60._0_16_,auVar109,0x7f);
                auVar100 = vmulss_avx512f(auVar108,auVar106);
                auVar108 = vmulss_avx512f(auVar106,auVar106);
                auVar106 = vdpps_avx(local_a60._0_16_,local_a30,0x7f);
                auVar191._0_16_ =
                     vaddss_avx512f(auVar107,ZEXT416((uint)(auVar100._0_4_ * auVar108._0_4_)));
                auVar100 = vfnmadd231ss_fma(auVar103,auVar105,ZEXT416((uint)fVar267));
                auVar107 = vfnmadd231ss_fma(auVar106,auVar105,auVar99);
                auVar103 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar232 = fVar232 - auVar103._0_4_;
                auVar103 = vshufps_avx(auVar104,auVar104,0xff);
                auVar106 = vfmsub213ss_fma(auVar100,auVar191._0_16_,auVar103);
                fVar262 = auVar107._0_4_ * auVar191._0_4_;
                auVar100 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar106._0_4_)),
                                           ZEXT416((uint)fVar267),ZEXT416((uint)fVar262));
                fVar263 = auVar100._0_4_;
                fVar256 = fVar256 - (fVar192 * (fVar262 / fVar263) -
                                    fVar232 * (auVar99._0_4_ / fVar263));
                fVar258 = fVar258 - (fVar232 * (fVar267 / fVar263) -
                                    fVar192 * (auVar106._0_4_ / fVar263));
                auVar246._8_4_ = 0x7fffffff;
                auVar246._0_8_ = 0x7fffffff7fffffff;
                auVar246._12_4_ = 0x7fffffff;
                auVar247 = ZEXT1664(auVar246);
                auVar99 = vandps_avx(auVar105,auVar246);
                if (auVar102._0_4_ <= auVar99._0_4_) {
LAB_01d808a9:
                  bVar5 = false;
                }
                else {
                  auVar105 = vfmadd231ss_fma(ZEXT416((uint)(auVar102._0_4_ + auVar248._0_4_)),
                                             local_a20,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(ZEXT416((uint)fVar232),auVar246);
                  if (auVar105._0_4_ <= auVar99._0_4_) goto LAB_01d808a9;
                  fVar258 = fVar258 + (float)local_a10._0_4_;
                  bVar5 = true;
                  if (fVar233 <= fVar258) {
                    fVar267 = *(float *)(ray + k * 4 + 0x200);
                    auVar247 = ZEXT464((uint)fVar267);
                    if (((fVar258 <= fVar267) && (0.0 <= fVar256)) && (fVar256 <= 1.0)) {
                      auVar162._16_48_ = auVar191._16_48_;
                      auVar162._0_16_ = ZEXT816(0) << 0x20;
                      auVar161._4_60_ = auVar162._4_60_;
                      auVar161._0_4_ = local_a80._0_4_;
                      auVar99 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar161._0_16_);
                      fVar192 = auVar99._0_4_;
                      auVar191._0_16_ = vmulss_avx512f(local_a80._0_16_,ZEXT416(0xbf000000));
                      pGVar2 = (context->scene->geometries).items[uVar94].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                        fVar192 = fVar192 * 1.5 + auVar191._0_4_ * fVar192 * fVar192 * fVar192;
                        auVar204._0_4_ = local_a60._0_4_ * fVar192;
                        auVar204._4_4_ = local_a60._4_4_ * fVar192;
                        auVar204._8_4_ = local_a60._8_4_ * fVar192;
                        auVar204._12_4_ = local_a60._12_4_ * fVar192;
                        auVar105 = vfmadd213ps_fma(auVar103,auVar204,auVar104);
                        auVar99 = vshufps_avx(auVar204,auVar204,0xc9);
                        auVar103 = vshufps_avx(auVar104,auVar104,0xc9);
                        auVar205._0_4_ = auVar204._0_4_ * auVar103._0_4_;
                        auVar205._4_4_ = auVar204._4_4_ * auVar103._4_4_;
                        auVar205._8_4_ = auVar204._8_4_ * auVar103._8_4_;
                        auVar205._12_4_ = auVar204._12_4_ * auVar103._12_4_;
                        auVar104 = vfmsub231ps_fma(auVar205,auVar104,auVar99);
                        auVar99 = vshufps_avx(auVar104,auVar104,0xc9);
                        auVar103 = vshufps_avx(auVar105,auVar105,0xc9);
                        auVar104 = vshufps_avx(auVar104,auVar104,0xd2);
                        auVar178._0_4_ = auVar105._0_4_ * auVar104._0_4_;
                        auVar178._4_4_ = auVar105._4_4_ * auVar104._4_4_;
                        auVar178._8_4_ = auVar105._8_4_ * auVar104._8_4_;
                        auVar178._12_4_ = auVar105._12_4_ * auVar104._12_4_;
                        auVar99 = vfmsub231ps_fma(auVar178,auVar99,auVar103);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x200) = fVar258;
                          uVar266 = vextractps_avx(auVar99,1);
                          *(undefined4 *)(ray + k * 4 + 0x300) = uVar266;
                          uVar266 = vextractps_avx(auVar99,2);
                          *(undefined4 *)(ray + k * 4 + 0x340) = uVar266;
                          *(int *)(ray + k * 4 + 0x380) = auVar99._0_4_;
                          *(float *)(ray + k * 4 + 0x3c0) = fVar256;
                          *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                          *(int *)(ray + k * 4 + 0x440) = (int)local_aa8;
                          *(uint *)(ray + k * 4 + 0x480) = uVar94;
                          *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar3 = context->user;
                          local_340 = vbroadcastss_avx512f(ZEXT416((uint)fVar256));
                          auVar191 = vbroadcastss_avx512f(ZEXT416(1));
                          auVar191 = vpermps_avx512f(auVar191,ZEXT1664(auVar99));
                          auVar154 = vbroadcastss_avx512f(ZEXT416(2));
                          local_3c0 = vpermps_avx512f(auVar154,ZEXT1664(auVar99));
                          local_380 = vbroadcastss_avx512f(auVar99);
                          local_400[0] = (RTCHitN)auVar191[0];
                          local_400[1] = (RTCHitN)auVar191[1];
                          local_400[2] = (RTCHitN)auVar191[2];
                          local_400[3] = (RTCHitN)auVar191[3];
                          local_400[4] = (RTCHitN)auVar191[4];
                          local_400[5] = (RTCHitN)auVar191[5];
                          local_400[6] = (RTCHitN)auVar191[6];
                          local_400[7] = (RTCHitN)auVar191[7];
                          local_400[8] = (RTCHitN)auVar191[8];
                          local_400[9] = (RTCHitN)auVar191[9];
                          local_400[10] = (RTCHitN)auVar191[10];
                          local_400[0xb] = (RTCHitN)auVar191[0xb];
                          local_400[0xc] = (RTCHitN)auVar191[0xc];
                          local_400[0xd] = (RTCHitN)auVar191[0xd];
                          local_400[0xe] = (RTCHitN)auVar191[0xe];
                          local_400[0xf] = (RTCHitN)auVar191[0xf];
                          local_400[0x10] = (RTCHitN)auVar191[0x10];
                          local_400[0x11] = (RTCHitN)auVar191[0x11];
                          local_400[0x12] = (RTCHitN)auVar191[0x12];
                          local_400[0x13] = (RTCHitN)auVar191[0x13];
                          local_400[0x14] = (RTCHitN)auVar191[0x14];
                          local_400[0x15] = (RTCHitN)auVar191[0x15];
                          local_400[0x16] = (RTCHitN)auVar191[0x16];
                          local_400[0x17] = (RTCHitN)auVar191[0x17];
                          local_400[0x18] = (RTCHitN)auVar191[0x18];
                          local_400[0x19] = (RTCHitN)auVar191[0x19];
                          local_400[0x1a] = (RTCHitN)auVar191[0x1a];
                          local_400[0x1b] = (RTCHitN)auVar191[0x1b];
                          local_400[0x1c] = (RTCHitN)auVar191[0x1c];
                          local_400[0x1d] = (RTCHitN)auVar191[0x1d];
                          local_400[0x1e] = (RTCHitN)auVar191[0x1e];
                          local_400[0x1f] = (RTCHitN)auVar191[0x1f];
                          local_400[0x20] = (RTCHitN)auVar191[0x20];
                          local_400[0x21] = (RTCHitN)auVar191[0x21];
                          local_400[0x22] = (RTCHitN)auVar191[0x22];
                          local_400[0x23] = (RTCHitN)auVar191[0x23];
                          local_400[0x24] = (RTCHitN)auVar191[0x24];
                          local_400[0x25] = (RTCHitN)auVar191[0x25];
                          local_400[0x26] = (RTCHitN)auVar191[0x26];
                          local_400[0x27] = (RTCHitN)auVar191[0x27];
                          local_400[0x28] = (RTCHitN)auVar191[0x28];
                          local_400[0x29] = (RTCHitN)auVar191[0x29];
                          local_400[0x2a] = (RTCHitN)auVar191[0x2a];
                          local_400[0x2b] = (RTCHitN)auVar191[0x2b];
                          local_400[0x2c] = (RTCHitN)auVar191[0x2c];
                          local_400[0x2d] = (RTCHitN)auVar191[0x2d];
                          local_400[0x2e] = (RTCHitN)auVar191[0x2e];
                          local_400[0x2f] = (RTCHitN)auVar191[0x2f];
                          local_400[0x30] = (RTCHitN)auVar191[0x30];
                          local_400[0x31] = (RTCHitN)auVar191[0x31];
                          local_400[0x32] = (RTCHitN)auVar191[0x32];
                          local_400[0x33] = (RTCHitN)auVar191[0x33];
                          local_400[0x34] = (RTCHitN)auVar191[0x34];
                          local_400[0x35] = (RTCHitN)auVar191[0x35];
                          local_400[0x36] = (RTCHitN)auVar191[0x36];
                          local_400[0x37] = (RTCHitN)auVar191[0x37];
                          local_400[0x38] = (RTCHitN)auVar191[0x38];
                          local_400[0x39] = (RTCHitN)auVar191[0x39];
                          local_400[0x3a] = (RTCHitN)auVar191[0x3a];
                          local_400[0x3b] = (RTCHitN)auVar191[0x3b];
                          local_400[0x3c] = (RTCHitN)auVar191[0x3c];
                          local_400[0x3d] = (RTCHitN)auVar191[0x3d];
                          local_400[0x3e] = (RTCHitN)auVar191[0x3e];
                          local_400[0x3f] = (RTCHitN)auVar191[0x3f];
                          local_300 = 0;
                          uStack_2f8 = 0;
                          uStack_2f0 = 0;
                          uStack_2e8 = 0;
                          uStack_2e0 = 0;
                          uStack_2d8 = 0;
                          uStack_2d0 = 0;
                          uStack_2c8 = 0;
                          local_2c0 = local_480._0_8_;
                          uStack_2b8 = local_480._8_8_;
                          uStack_2b0 = local_480._16_8_;
                          uStack_2a8 = local_480._24_8_;
                          uStack_2a0 = local_480._32_8_;
                          uStack_298 = local_480._40_8_;
                          uStack_290 = local_480._48_8_;
                          uStack_288 = local_480._56_8_;
                          auVar191 = vmovdqa64_avx512f(local_440);
                          local_280 = vmovdqa64_avx512f(auVar191);
                          auVar113 = vpcmpeqd_avx2(auVar191._0_32_,auVar191._0_32_);
                          local_ac8[3] = auVar113;
                          local_ac8[2] = auVar113;
                          local_ac8[1] = auVar113;
                          *local_ac8 = auVar113;
                          local_240 = vbroadcastss_avx512f(ZEXT416(pRVar3->instID[0]));
                          local_200 = vbroadcastss_avx512f(ZEXT416(pRVar3->instPrimID[0]));
                          *(float *)(ray + k * 4 + 0x200) = fVar258;
                          local_8c0 = local_4c0;
                          local_b10.valid = (int *)local_8c0;
                          local_b10.geometryUserPtr = pGVar2->userPtr;
                          local_b10.context = context->user;
                          local_b10.hit = local_400;
                          local_b10.N = 0x10;
                          local_b10.ray = (RTCRayN *)ray;
                          if (pGVar2->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar2->intersectionFilterN)(&local_b10);
                            auVar272 = ZEXT3264(local_aa0);
                          }
                          auVar191 = vmovdqa64_avx512f(local_8c0);
                          uVar21 = vptestmd_avx512f(auVar191,auVar191);
                          if ((short)uVar21 == 0) {
LAB_01d80b6d:
                            *(float *)(ray + k * 4 + 0x200) = fVar267;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var4)(&local_b10);
                              auVar272 = ZEXT3264(local_aa0);
                            }
                            auVar191 = vmovdqa64_avx512f(local_8c0);
                            uVar97 = vptestmd_avx512f(auVar191,auVar191);
                            if ((short)uVar97 == 0) goto LAB_01d80b6d;
                            iVar65 = *(int *)(local_b10.hit + 4);
                            iVar66 = *(int *)(local_b10.hit + 8);
                            iVar67 = *(int *)(local_b10.hit + 0xc);
                            iVar68 = *(int *)(local_b10.hit + 0x10);
                            iVar69 = *(int *)(local_b10.hit + 0x14);
                            iVar70 = *(int *)(local_b10.hit + 0x18);
                            iVar71 = *(int *)(local_b10.hit + 0x1c);
                            iVar72 = *(int *)(local_b10.hit + 0x20);
                            iVar73 = *(int *)(local_b10.hit + 0x24);
                            iVar74 = *(int *)(local_b10.hit + 0x28);
                            iVar75 = *(int *)(local_b10.hit + 0x2c);
                            iVar76 = *(int *)(local_b10.hit + 0x30);
                            iVar77 = *(int *)(local_b10.hit + 0x34);
                            iVar78 = *(int *)(local_b10.hit + 0x38);
                            iVar79 = *(int *)(local_b10.hit + 0x3c);
                            bVar92 = (byte)uVar97;
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar97 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar97 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar97 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar97 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar97 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar97 >> 7) & 1);
                            bVar88 = (byte)(uVar97 >> 8);
                            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            bVar18 = SUB81(uVar97 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x300) =
                                 (uint)(bVar92 & 1) * *(int *)local_b10.hit |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b10.ray + 0x300);
                            *(uint *)(local_b10.ray + 0x304) =
                                 (uint)bVar96 * iVar65 |
                                 (uint)!bVar96 * *(int *)(local_b10.ray + 0x304);
                            *(uint *)(local_b10.ray + 0x308) =
                                 (uint)bVar6 * iVar66 |
                                 (uint)!bVar6 * *(int *)(local_b10.ray + 0x308);
                            *(uint *)(local_b10.ray + 0x30c) =
                                 (uint)bVar7 * iVar67 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x30c);
                            *(uint *)(local_b10.ray + 0x310) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x310);
                            *(uint *)(local_b10.ray + 0x314) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x314);
                            *(uint *)(local_b10.ray + 0x318) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x318);
                            *(uint *)(local_b10.ray + 0x31c) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x31c);
                            *(uint *)(local_b10.ray + 800) =
                                 (uint)(bVar88 & 1) * iVar72 |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_b10.ray + 800);
                            *(uint *)(local_b10.ray + 0x324) =
                                 (uint)bVar12 * iVar73 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x324);
                            *(uint *)(local_b10.ray + 0x328) =
                                 (uint)bVar13 * iVar74 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x328);
                            *(uint *)(local_b10.ray + 0x32c) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x32c);
                            *(uint *)(local_b10.ray + 0x330) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x330);
                            *(uint *)(local_b10.ray + 0x334) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x334);
                            *(uint *)(local_b10.ray + 0x338) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x338);
                            *(uint *)(local_b10.ray + 0x33c) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x33c);
                            iVar65 = *(int *)(local_b10.hit + 0x44);
                            iVar66 = *(int *)(local_b10.hit + 0x48);
                            iVar67 = *(int *)(local_b10.hit + 0x4c);
                            iVar68 = *(int *)(local_b10.hit + 0x50);
                            iVar69 = *(int *)(local_b10.hit + 0x54);
                            iVar70 = *(int *)(local_b10.hit + 0x58);
                            iVar71 = *(int *)(local_b10.hit + 0x5c);
                            iVar72 = *(int *)(local_b10.hit + 0x60);
                            iVar73 = *(int *)(local_b10.hit + 100);
                            iVar74 = *(int *)(local_b10.hit + 0x68);
                            iVar75 = *(int *)(local_b10.hit + 0x6c);
                            iVar76 = *(int *)(local_b10.hit + 0x70);
                            iVar77 = *(int *)(local_b10.hit + 0x74);
                            iVar78 = *(int *)(local_b10.hit + 0x78);
                            iVar79 = *(int *)(local_b10.hit + 0x7c);
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar97 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar97 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar97 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar97 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar97 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar97 >> 7) & 1);
                            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            bVar18 = SUB81(uVar97 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x340) =
                                 (uint)(bVar92 & 1) * *(int *)(local_b10.hit + 0x40) |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b10.ray + 0x340);
                            *(uint *)(local_b10.ray + 0x344) =
                                 (uint)bVar96 * iVar65 |
                                 (uint)!bVar96 * *(int *)(local_b10.ray + 0x344);
                            *(uint *)(local_b10.ray + 0x348) =
                                 (uint)bVar6 * iVar66 |
                                 (uint)!bVar6 * *(int *)(local_b10.ray + 0x348);
                            *(uint *)(local_b10.ray + 0x34c) =
                                 (uint)bVar7 * iVar67 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x34c);
                            *(uint *)(local_b10.ray + 0x350) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x350);
                            *(uint *)(local_b10.ray + 0x354) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x354);
                            *(uint *)(local_b10.ray + 0x358) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x358);
                            *(uint *)(local_b10.ray + 0x35c) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x35c);
                            *(uint *)(local_b10.ray + 0x360) =
                                 (uint)(bVar88 & 1) * iVar72 |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_b10.ray + 0x360);
                            *(uint *)(local_b10.ray + 0x364) =
                                 (uint)bVar12 * iVar73 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x364);
                            *(uint *)(local_b10.ray + 0x368) =
                                 (uint)bVar13 * iVar74 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x368);
                            *(uint *)(local_b10.ray + 0x36c) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x36c);
                            *(uint *)(local_b10.ray + 0x370) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x370);
                            *(uint *)(local_b10.ray + 0x374) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x374);
                            *(uint *)(local_b10.ray + 0x378) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x378);
                            *(uint *)(local_b10.ray + 0x37c) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x37c);
                            iVar65 = *(int *)(local_b10.hit + 0x84);
                            iVar66 = *(int *)(local_b10.hit + 0x88);
                            iVar67 = *(int *)(local_b10.hit + 0x8c);
                            iVar68 = *(int *)(local_b10.hit + 0x90);
                            iVar69 = *(int *)(local_b10.hit + 0x94);
                            iVar70 = *(int *)(local_b10.hit + 0x98);
                            iVar71 = *(int *)(local_b10.hit + 0x9c);
                            iVar72 = *(int *)(local_b10.hit + 0xa0);
                            iVar73 = *(int *)(local_b10.hit + 0xa4);
                            iVar74 = *(int *)(local_b10.hit + 0xa8);
                            iVar75 = *(int *)(local_b10.hit + 0xac);
                            iVar76 = *(int *)(local_b10.hit + 0xb0);
                            iVar77 = *(int *)(local_b10.hit + 0xb4);
                            iVar78 = *(int *)(local_b10.hit + 0xb8);
                            iVar79 = *(int *)(local_b10.hit + 0xbc);
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar97 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar97 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar97 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar97 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar97 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar97 >> 7) & 1);
                            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            bVar18 = SUB81(uVar97 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x380) =
                                 (uint)(bVar92 & 1) * *(int *)(local_b10.hit + 0x80) |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b10.ray + 0x380);
                            *(uint *)(local_b10.ray + 900) =
                                 (uint)bVar96 * iVar65 |
                                 (uint)!bVar96 * *(int *)(local_b10.ray + 900);
                            *(uint *)(local_b10.ray + 0x388) =
                                 (uint)bVar6 * iVar66 |
                                 (uint)!bVar6 * *(int *)(local_b10.ray + 0x388);
                            *(uint *)(local_b10.ray + 0x38c) =
                                 (uint)bVar7 * iVar67 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x38c);
                            *(uint *)(local_b10.ray + 0x390) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x390);
                            *(uint *)(local_b10.ray + 0x394) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x394);
                            *(uint *)(local_b10.ray + 0x398) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x398);
                            *(uint *)(local_b10.ray + 0x39c) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x39c);
                            *(uint *)(local_b10.ray + 0x3a0) =
                                 (uint)(bVar88 & 1) * iVar72 |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_b10.ray + 0x3a0);
                            *(uint *)(local_b10.ray + 0x3a4) =
                                 (uint)bVar12 * iVar73 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x3a4);
                            *(uint *)(local_b10.ray + 0x3a8) =
                                 (uint)bVar13 * iVar74 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x3a8);
                            *(uint *)(local_b10.ray + 0x3ac) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3ac);
                            *(uint *)(local_b10.ray + 0x3b0) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3b0);
                            *(uint *)(local_b10.ray + 0x3b4) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3b4);
                            *(uint *)(local_b10.ray + 0x3b8) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3b8);
                            *(uint *)(local_b10.ray + 0x3bc) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3bc);
                            iVar65 = *(int *)(local_b10.hit + 0xc4);
                            iVar66 = *(int *)(local_b10.hit + 200);
                            iVar67 = *(int *)(local_b10.hit + 0xcc);
                            iVar68 = *(int *)(local_b10.hit + 0xd0);
                            iVar69 = *(int *)(local_b10.hit + 0xd4);
                            iVar70 = *(int *)(local_b10.hit + 0xd8);
                            iVar71 = *(int *)(local_b10.hit + 0xdc);
                            iVar72 = *(int *)(local_b10.hit + 0xe0);
                            iVar73 = *(int *)(local_b10.hit + 0xe4);
                            iVar74 = *(int *)(local_b10.hit + 0xe8);
                            iVar75 = *(int *)(local_b10.hit + 0xec);
                            iVar76 = *(int *)(local_b10.hit + 0xf0);
                            iVar77 = *(int *)(local_b10.hit + 0xf4);
                            iVar78 = *(int *)(local_b10.hit + 0xf8);
                            iVar79 = *(int *)(local_b10.hit + 0xfc);
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar97 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar97 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar97 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar97 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar97 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar97 >> 7) & 1);
                            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            bVar18 = SUB81(uVar97 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x3c0) =
                                 (uint)(bVar92 & 1) * *(int *)(local_b10.hit + 0xc0) |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b10.ray + 0x3c0);
                            *(uint *)(local_b10.ray + 0x3c4) =
                                 (uint)bVar96 * iVar65 |
                                 (uint)!bVar96 * *(int *)(local_b10.ray + 0x3c4);
                            *(uint *)(local_b10.ray + 0x3c8) =
                                 (uint)bVar6 * iVar66 |
                                 (uint)!bVar6 * *(int *)(local_b10.ray + 0x3c8);
                            *(uint *)(local_b10.ray + 0x3cc) =
                                 (uint)bVar7 * iVar67 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x3cc);
                            *(uint *)(local_b10.ray + 0x3d0) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x3d0);
                            *(uint *)(local_b10.ray + 0x3d4) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x3d4);
                            *(uint *)(local_b10.ray + 0x3d8) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x3d8);
                            *(uint *)(local_b10.ray + 0x3dc) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x3dc);
                            *(uint *)(local_b10.ray + 0x3e0) =
                                 (uint)(bVar88 & 1) * iVar72 |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_b10.ray + 0x3e0);
                            *(uint *)(local_b10.ray + 0x3e4) =
                                 (uint)bVar12 * iVar73 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x3e4);
                            *(uint *)(local_b10.ray + 1000) =
                                 (uint)bVar13 * iVar74 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 1000);
                            *(uint *)(local_b10.ray + 0x3ec) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3ec);
                            *(uint *)(local_b10.ray + 0x3f0) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3f0);
                            *(uint *)(local_b10.ray + 0x3f4) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3f4);
                            *(uint *)(local_b10.ray + 0x3f8) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3f8);
                            *(uint *)(local_b10.ray + 0x3fc) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3fc);
                            iVar65 = *(int *)(local_b10.hit + 0x104);
                            iVar66 = *(int *)(local_b10.hit + 0x108);
                            iVar67 = *(int *)(local_b10.hit + 0x10c);
                            iVar68 = *(int *)(local_b10.hit + 0x110);
                            iVar69 = *(int *)(local_b10.hit + 0x114);
                            iVar70 = *(int *)(local_b10.hit + 0x118);
                            iVar71 = *(int *)(local_b10.hit + 0x11c);
                            iVar72 = *(int *)(local_b10.hit + 0x120);
                            iVar73 = *(int *)(local_b10.hit + 0x124);
                            iVar74 = *(int *)(local_b10.hit + 0x128);
                            iVar75 = *(int *)(local_b10.hit + 300);
                            iVar76 = *(int *)(local_b10.hit + 0x130);
                            iVar77 = *(int *)(local_b10.hit + 0x134);
                            iVar78 = *(int *)(local_b10.hit + 0x138);
                            iVar79 = *(int *)(local_b10.hit + 0x13c);
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            bVar6 = (bool)((byte)(uVar97 >> 2) & 1);
                            bVar7 = (bool)((byte)(uVar97 >> 3) & 1);
                            bVar8 = (bool)((byte)(uVar97 >> 4) & 1);
                            bVar9 = (bool)((byte)(uVar97 >> 5) & 1);
                            bVar10 = (bool)((byte)(uVar97 >> 6) & 1);
                            bVar11 = (bool)((byte)(uVar97 >> 7) & 1);
                            bVar12 = (bool)((byte)(uVar97 >> 9) & 1);
                            bVar13 = (bool)((byte)(uVar97 >> 10) & 1);
                            bVar14 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            bVar15 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            bVar16 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            bVar17 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            bVar18 = SUB81(uVar97 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x400) =
                                 (uint)(bVar92 & 1) * *(int *)(local_b10.hit + 0x100) |
                                 (uint)!(bool)(bVar92 & 1) * *(int *)(local_b10.ray + 0x400);
                            *(uint *)(local_b10.ray + 0x404) =
                                 (uint)bVar96 * iVar65 |
                                 (uint)!bVar96 * *(int *)(local_b10.ray + 0x404);
                            *(uint *)(local_b10.ray + 0x408) =
                                 (uint)bVar6 * iVar66 |
                                 (uint)!bVar6 * *(int *)(local_b10.ray + 0x408);
                            *(uint *)(local_b10.ray + 0x40c) =
                                 (uint)bVar7 * iVar67 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x40c);
                            *(uint *)(local_b10.ray + 0x410) =
                                 (uint)bVar8 * iVar68 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x410);
                            *(uint *)(local_b10.ray + 0x414) =
                                 (uint)bVar9 * iVar69 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x414);
                            *(uint *)(local_b10.ray + 0x418) =
                                 (uint)bVar10 * iVar70 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x418);
                            *(uint *)(local_b10.ray + 0x41c) =
                                 (uint)bVar11 * iVar71 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x41c);
                            *(uint *)(local_b10.ray + 0x420) =
                                 (uint)(bVar88 & 1) * iVar72 |
                                 (uint)!(bool)(bVar88 & 1) * *(int *)(local_b10.ray + 0x420);
                            *(uint *)(local_b10.ray + 0x424) =
                                 (uint)bVar12 * iVar73 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x424);
                            *(uint *)(local_b10.ray + 0x428) =
                                 (uint)bVar13 * iVar74 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x428);
                            *(uint *)(local_b10.ray + 0x42c) =
                                 (uint)bVar14 * iVar75 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x42c);
                            *(uint *)(local_b10.ray + 0x430) =
                                 (uint)bVar15 * iVar76 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x430);
                            *(uint *)(local_b10.ray + 0x434) =
                                 (uint)bVar16 * iVar77 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x434);
                            *(uint *)(local_b10.ray + 0x438) =
                                 (uint)bVar17 * iVar78 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x438);
                            *(uint *)(local_b10.ray + 0x43c) =
                                 (uint)bVar18 * iVar79 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x43c);
                            auVar191 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x140));
                            auVar191 = vmovdqu32_avx512f(auVar191);
                            *(undefined1 (*) [64])(local_b10.ray + 0x440) = auVar191;
                            auVar191 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x180));
                            auVar191 = vmovdqu32_avx512f(auVar191);
                            *(undefined1 (*) [64])(local_b10.ray + 0x480) = auVar191;
                            auVar154 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x1c0));
                            auVar191 = vmovdqa32_avx512f(auVar154);
                            *(undefined1 (*) [64])(local_b10.ray + 0x4c0) = auVar191;
                            auVar231 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x200));
                            bVar96 = (bool)((byte)(uVar97 >> 1) & 1);
                            auVar63._4_56_ = auVar231._8_56_;
                            auVar63._0_4_ =
                                 (uint)bVar96 * auVar231._4_4_ | (uint)!bVar96 * auVar154._4_4_;
                            auVar191._0_8_ = auVar63._0_8_ << 0x20;
                            bVar96 = (bool)((byte)(uVar97 >> 2) & 1);
                            auVar191._8_4_ =
                                 (uint)bVar96 * auVar231._8_4_ | (uint)!bVar96 * auVar154._8_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 3) & 1);
                            auVar191._12_4_ =
                                 (uint)bVar96 * auVar231._12_4_ | (uint)!bVar96 * auVar154._12_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 4) & 1);
                            auVar191._16_4_ =
                                 (uint)bVar96 * auVar231._16_4_ | (uint)!bVar96 * auVar154._16_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 5) & 1);
                            auVar191._20_4_ =
                                 (uint)bVar96 * auVar231._20_4_ | (uint)!bVar96 * auVar154._20_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 6) & 1);
                            auVar191._24_4_ =
                                 (uint)bVar96 * auVar231._24_4_ | (uint)!bVar96 * auVar154._24_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 7) & 1);
                            auVar191._28_4_ =
                                 (uint)bVar96 * auVar231._28_4_ | (uint)!bVar96 * auVar154._28_4_;
                            auVar191._32_4_ =
                                 (uint)(bVar88 & 1) * auVar231._32_4_ |
                                 (uint)!(bool)(bVar88 & 1) * auVar154._32_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 9) & 1);
                            auVar191._36_4_ =
                                 (uint)bVar96 * auVar231._36_4_ | (uint)!bVar96 * auVar154._36_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 10) & 1);
                            auVar191._40_4_ =
                                 (uint)bVar96 * auVar231._40_4_ | (uint)!bVar96 * auVar154._40_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 0xb) & 1);
                            auVar191._44_4_ =
                                 (uint)bVar96 * auVar231._44_4_ | (uint)!bVar96 * auVar154._44_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 0xc) & 1);
                            auVar191._48_4_ =
                                 (uint)bVar96 * auVar231._48_4_ | (uint)!bVar96 * auVar154._48_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 0xd) & 1);
                            auVar191._52_4_ =
                                 (uint)bVar96 * auVar231._52_4_ | (uint)!bVar96 * auVar154._52_4_;
                            bVar96 = (bool)((byte)(uVar97 >> 0xe) & 1);
                            auVar191._56_4_ =
                                 (uint)bVar96 * auVar231._56_4_ | (uint)!bVar96 * auVar154._56_4_;
                            bVar96 = SUB81(uVar97 >> 0xf,0);
                            auVar191._60_4_ =
                                 (uint)bVar96 * auVar231._60_4_ | (uint)!bVar96 * auVar154._60_4_;
                            auVar154 = vmovdqa32_avx512f(auVar231);
                            *(undefined1 (*) [64])(local_b10.ray + 0x500) = auVar154;
                          }
                          auVar247 = ZEXT464((uint)fVar267);
                        }
                      }
                    }
                  }
                }
                bVar96 = lVar95 != 0;
                lVar95 = lVar95 + -1;
              } while ((!bVar5) && (bVar96));
              auVar81._4_4_ = fStack_85c;
              auVar81._0_4_ = local_860;
              auVar81._8_4_ = fStack_858;
              auVar81._12_4_ = fStack_854;
              auVar81._16_4_ = fStack_850;
              auVar81._20_4_ = fStack_84c;
              auVar81._24_4_ = fStack_848;
              auVar81._28_4_ = fStack_844;
              uVar266 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar41._4_4_ = uVar266;
              auVar41._0_4_ = uVar266;
              auVar41._8_4_ = uVar266;
              auVar41._12_4_ = uVar266;
              auVar41._16_4_ = uVar266;
              auVar41._20_4_ = uVar266;
              auVar41._24_4_ = uVar266;
              auVar41._28_4_ = uVar266;
              uVar21 = vcmpps_avx512vl(auVar81,auVar41,2);
              bVar93 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar93 & (byte)uVar21;
            } while (bVar93 != 0);
          }
          uVar23 = vpcmpd_avx512vl(local_800,_local_880,1);
          uVar22 = vpcmpd_avx512vl(local_800,local_780,1);
          auVar210._0_4_ = (float)local_900._0_4_ + (float)local_500._0_4_;
          auVar210._4_4_ = (float)local_900._4_4_ + (float)local_500._4_4_;
          auVar210._8_4_ = fStack_8f8 + fStack_4f8;
          auVar210._12_4_ = fStack_8f4 + fStack_4f4;
          auVar210._16_4_ = fStack_8f0 + fStack_4f0;
          auVar210._20_4_ = fStack_8ec + fStack_4ec;
          auVar210._24_4_ = fStack_8e8 + fStack_4e8;
          auVar210._28_4_ = fStack_8e4 + fStack_4e4;
          uVar266 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar230._4_4_ = uVar266;
          auVar230._0_4_ = uVar266;
          auVar230._8_4_ = uVar266;
          auVar230._12_4_ = uVar266;
          auVar230._16_4_ = uVar266;
          auVar230._20_4_ = uVar266;
          auVar230._24_4_ = uVar266;
          auVar230._28_4_ = uVar266;
          uVar21 = vcmpps_avx512vl(auVar210,auVar230,2);
          bVar90 = bVar90 & (byte)uVar22 & (byte)uVar21;
          auVar236._0_4_ = (float)local_900._0_4_ + local_7c0._0_4_;
          auVar236._4_4_ = (float)local_900._4_4_ + local_7c0._4_4_;
          auVar236._8_4_ = fStack_8f8 + local_7c0._8_4_;
          auVar236._12_4_ = fStack_8f4 + local_7c0._12_4_;
          auVar236._16_4_ = fStack_8f0 + local_7c0._16_4_;
          auVar236._20_4_ = fStack_8ec + local_7c0._20_4_;
          auVar236._24_4_ = fStack_8e8 + local_7c0._24_4_;
          auVar236._28_4_ = fStack_8e4 + local_7c0._28_4_;
          uVar21 = vcmpps_avx512vl(auVar236,auVar230,2);
          bVar86 = bVar86 & (byte)uVar23 & (byte)uVar21 | bVar90;
          prim = local_ac0;
          if (bVar86 == 0) {
            auVar237 = ZEXT3264(_DAT_02020f20);
          }
          else {
            uVar97 = local_ab8 & 0xffffffff;
            abStack_1a0[uVar97 * 0x60] = bVar86;
            auVar152._0_4_ =
                 (uint)(bVar90 & 1) * local_500._0_4_ |
                 (uint)!(bool)(bVar90 & 1) * (int)local_7c0._0_4_;
            bVar5 = (bool)(bVar90 >> 1 & 1);
            auVar152._4_4_ = (uint)bVar5 * local_500._4_4_ | (uint)!bVar5 * (int)local_7c0._4_4_;
            bVar5 = (bool)(bVar90 >> 2 & 1);
            auVar152._8_4_ = (uint)bVar5 * (int)fStack_4f8 | (uint)!bVar5 * (int)local_7c0._8_4_;
            bVar5 = (bool)(bVar90 >> 3 & 1);
            auVar152._12_4_ = (uint)bVar5 * (int)fStack_4f4 | (uint)!bVar5 * (int)local_7c0._12_4_;
            bVar5 = (bool)(bVar90 >> 4 & 1);
            auVar152._16_4_ = (uint)bVar5 * (int)fStack_4f0 | (uint)!bVar5 * (int)local_7c0._16_4_;
            bVar5 = (bool)(bVar90 >> 5 & 1);
            auVar152._20_4_ = (uint)bVar5 * (int)fStack_4ec | (uint)!bVar5 * (int)local_7c0._20_4_;
            auVar152._24_4_ =
                 (uint)(bVar90 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar90 >> 6) * (int)local_7c0._24_4_;
            auVar152._28_4_ = local_7c0._28_4_;
            auVar191._0_32_ = auVar152;
            *(undefined1 (*) [32])(auStack_180 + uVar97 * 0x60) = auVar152;
            uVar21 = vmovlps_avx(local_ae0);
            *(undefined8 *)(afStack_160 + uVar97 * 0x18) = uVar21;
            auStack_158[uVar97 * 0x18] = (int)local_9a8 + 1;
            local_ab8 = (ulong)((int)local_ab8 + 1);
            auVar237 = ZEXT3264(_DAT_02020f20);
          }
        }
      }
    }
    auVar231 = ZEXT1664(local_ae0);
    local_ab8 = local_ab8 & 0xffffffff;
    do {
      if ((int)local_ab8 == 0) {
        uVar266 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar43._4_4_ = uVar266;
        auVar43._0_4_ = uVar266;
        auVar43._8_4_ = uVar266;
        auVar43._12_4_ = uVar266;
        auVar43._16_4_ = uVar266;
        auVar43._20_4_ = uVar266;
        auVar43._24_4_ = uVar266;
        auVar43._28_4_ = uVar266;
        uVar21 = vcmpps_avx512vl(local_760,auVar43,2);
        uVar94 = (uint)uVar21 & (uint)local_ab0 - 1 & (uint)local_ab0;
        local_ab0 = (ulong)uVar94;
        if (uVar94 == 0) {
          return;
        }
        goto LAB_01d7e770;
      }
      uVar97 = (ulong)((int)local_ab8 - 1);
      lVar95 = uVar97 * 0x60;
      auVar113 = *(undefined1 (*) [32])(auStack_180 + lVar95);
      auVar211._0_4_ = auVar113._0_4_ + (float)local_900._0_4_;
      auVar211._4_4_ = auVar113._4_4_ + (float)local_900._4_4_;
      auVar211._8_4_ = auVar113._8_4_ + fStack_8f8;
      auVar211._12_4_ = auVar113._12_4_ + fStack_8f4;
      auVar211._16_4_ = auVar113._16_4_ + fStack_8f0;
      auVar211._20_4_ = auVar113._20_4_ + fStack_8ec;
      auVar211._24_4_ = auVar113._24_4_ + fStack_8e8;
      auVar211._28_4_ = auVar113._28_4_ + fStack_8e4;
      uVar266 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar42._4_4_ = uVar266;
      auVar42._0_4_ = uVar266;
      auVar42._8_4_ = uVar266;
      auVar42._12_4_ = uVar266;
      auVar42._16_4_ = uVar266;
      auVar42._20_4_ = uVar266;
      auVar42._24_4_ = uVar266;
      auVar42._28_4_ = uVar266;
      uVar21 = vcmpps_avx512vl(auVar211,auVar42,2);
      uVar98 = (uint)uVar21 & (uint)abStack_1a0[lVar95];
      bVar86 = (byte)uVar98;
      if (uVar98 != 0) {
        auVar212._8_4_ = 0x7f800000;
        auVar212._0_8_ = 0x7f8000007f800000;
        auVar212._12_4_ = 0x7f800000;
        auVar212._16_4_ = 0x7f800000;
        auVar212._20_4_ = 0x7f800000;
        auVar212._24_4_ = 0x7f800000;
        auVar212._28_4_ = 0x7f800000;
        auVar116 = vblendmps_avx512vl(auVar212,auVar113);
        auVar153._0_4_ =
             (uint)(bVar86 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar86 & 1) * (int)auVar113._0_4_;
        bVar5 = (bool)((byte)(uVar98 >> 1) & 1);
        auVar153._4_4_ = (uint)bVar5 * auVar116._4_4_ | (uint)!bVar5 * (int)auVar113._4_4_;
        bVar5 = (bool)((byte)(uVar98 >> 2) & 1);
        auVar153._8_4_ = (uint)bVar5 * auVar116._8_4_ | (uint)!bVar5 * (int)auVar113._8_4_;
        bVar5 = (bool)((byte)(uVar98 >> 3) & 1);
        auVar153._12_4_ = (uint)bVar5 * auVar116._12_4_ | (uint)!bVar5 * (int)auVar113._12_4_;
        bVar5 = (bool)((byte)(uVar98 >> 4) & 1);
        auVar153._16_4_ = (uint)bVar5 * auVar116._16_4_ | (uint)!bVar5 * (int)auVar113._16_4_;
        bVar5 = (bool)((byte)(uVar98 >> 5) & 1);
        auVar153._20_4_ = (uint)bVar5 * auVar116._20_4_ | (uint)!bVar5 * (int)auVar113._20_4_;
        bVar5 = (bool)((byte)(uVar98 >> 6) & 1);
        auVar153._24_4_ = (uint)bVar5 * auVar116._24_4_ | (uint)!bVar5 * (int)auVar113._24_4_;
        auVar153._28_4_ =
             (uVar98 >> 7) * auVar116._28_4_ | (uint)!SUB41(uVar98 >> 7,0) * (int)auVar113._28_4_;
        auVar191._0_32_ = auVar153;
        auVar113 = vshufps_avx(auVar153,auVar153,0xb1);
        auVar113 = vminps_avx(auVar153,auVar113);
        auVar116 = vshufpd_avx(auVar113,auVar113,5);
        auVar113 = vminps_avx(auVar113,auVar116);
        auVar116 = vpermpd_avx2(auVar113,0x4e);
        auVar113 = vminps_avx(auVar113,auVar116);
        uVar21 = vcmpps_avx512vl(auVar153,auVar113,0);
        bVar93 = (byte)uVar21 & bVar86;
        if (bVar93 != 0) {
          uVar98 = (uint)bVar93;
        }
        fVar170 = afStack_160[uVar97 * 0x18 + 1];
        uVar163 = 0;
        for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
          uVar163 = uVar163 + 1;
        }
        local_9a8 = (ulong)auStack_158[uVar97 * 0x18];
        bVar93 = ~('\x01' << ((byte)uVar163 & 0x1f)) & bVar86;
        abStack_1a0[lVar95] = bVar93;
        uVar89 = uVar97;
        if (bVar93 != 0) {
          uVar89 = local_ab8;
        }
        fVar256 = afStack_160[uVar97 * 0x18];
        auVar213._4_4_ = fVar256;
        auVar213._0_4_ = fVar256;
        auVar213._8_4_ = fVar256;
        auVar213._12_4_ = fVar256;
        auVar213._16_4_ = fVar256;
        auVar213._20_4_ = fVar256;
        auVar213._24_4_ = fVar256;
        auVar213._28_4_ = fVar256;
        fVar170 = fVar170 - fVar256;
        auVar190._4_4_ = fVar170;
        auVar190._0_4_ = fVar170;
        auVar190._8_4_ = fVar170;
        auVar190._12_4_ = fVar170;
        auVar190._16_4_ = fVar170;
        auVar190._20_4_ = fVar170;
        auVar190._24_4_ = fVar170;
        auVar190._28_4_ = fVar170;
        auVar99 = vfmadd132ps_fma(auVar190,auVar213,auVar237._0_32_);
        auVar113 = ZEXT1632(auVar99);
        local_400[0] = (RTCHitN)auVar113[0];
        local_400[1] = (RTCHitN)auVar113[1];
        local_400[2] = (RTCHitN)auVar113[2];
        local_400[3] = (RTCHitN)auVar113[3];
        local_400[4] = (RTCHitN)auVar113[4];
        local_400[5] = (RTCHitN)auVar113[5];
        local_400[6] = (RTCHitN)auVar113[6];
        local_400[7] = (RTCHitN)auVar113[7];
        local_400[8] = (RTCHitN)auVar113[8];
        local_400[9] = (RTCHitN)auVar113[9];
        local_400[10] = (RTCHitN)auVar113[10];
        local_400[0xb] = (RTCHitN)auVar113[0xb];
        local_400[0xc] = (RTCHitN)auVar113[0xc];
        local_400[0xd] = (RTCHitN)auVar113[0xd];
        local_400[0xe] = (RTCHitN)auVar113[0xe];
        local_400[0xf] = (RTCHitN)auVar113[0xf];
        local_400[0x10] = (RTCHitN)auVar113[0x10];
        local_400[0x11] = (RTCHitN)auVar113[0x11];
        local_400[0x12] = (RTCHitN)auVar113[0x12];
        local_400[0x13] = (RTCHitN)auVar113[0x13];
        local_400[0x14] = (RTCHitN)auVar113[0x14];
        local_400[0x15] = (RTCHitN)auVar113[0x15];
        local_400[0x16] = (RTCHitN)auVar113[0x16];
        local_400[0x17] = (RTCHitN)auVar113[0x17];
        local_400[0x18] = (RTCHitN)auVar113[0x18];
        local_400[0x19] = (RTCHitN)auVar113[0x19];
        local_400[0x1a] = (RTCHitN)auVar113[0x1a];
        local_400[0x1b] = (RTCHitN)auVar113[0x1b];
        local_400[0x1c] = (RTCHitN)auVar113[0x1c];
        local_400[0x1d] = (RTCHitN)auVar113[0x1d];
        local_400[0x1e] = (RTCHitN)auVar113[0x1e];
        local_400[0x1f] = (RTCHitN)auVar113[0x1f];
        auVar231 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar163 * 4));
        uVar97 = uVar89;
      }
      local_ab8 = uVar97;
    } while (bVar86 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }